

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline(Convolution_x86_avx512 *this,Option *opt)

{
  Mat *this_00;
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar11;
  pointer pMVar6;
  size_t sVar7;
  int *piVar8;
  Allocator *pAVar9;
  size_t sVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  bool bVar21;
  byte bVar22;
  byte bVar23;
  int iVar24;
  Layer *pLVar25;
  long lVar26;
  long lVar27;
  void *pvVar28;
  byte bVar29;
  uint uVar30;
  pointer pMVar31;
  long lVar32;
  undefined1 (*pauVar33) [64];
  long lVar34;
  byte bVar35;
  int k;
  pointer pMVar36;
  ulong uVar37;
  long lVar38;
  void *pvVar39;
  int k_3;
  long lVar40;
  void *pvVar41;
  uint _h;
  int iVar42;
  undefined4 *puVar43;
  long lVar44;
  long lVar45;
  uint uVar46;
  ulong uVar47;
  long lVar48;
  undefined1 (*pauVar49) [32];
  ulong uVar50;
  uint uVar51;
  uint uVar52;
  int iVar53;
  _func_int **pp_Var54;
  void *pvVar55;
  int k_5;
  uint uVar56;
  ulong uVar57;
  long lVar58;
  void *pvVar59;
  int k_4;
  int iVar60;
  long lVar61;
  _func_int **pp_Var62;
  undefined1 (*pauVar63) [64];
  void *pvVar64;
  int k_6;
  int iVar65;
  long lVar66;
  long lVar67;
  ulong uVar68;
  long lVar69;
  long lVar70;
  undefined4 *puVar71;
  ulong uVar72;
  uint uVar73;
  int iVar74;
  int i;
  uint uVar75;
  ulong uVar76;
  _func_int **pp_Var77;
  long lVar78;
  void *pvVar79;
  long lVar80;
  void *pvVar81;
  void *pvVar82;
  int iVar83;
  int iVar84;
  long lVar85;
  void *pvVar86;
  undefined8 uVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  void *local_2d8;
  long local_2c0;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  void *local_298;
  long local_288;
  long local_280;
  long local_278;
  int local_270;
  int local_268;
  void *local_258;
  long local_250;
  int local_248;
  void *local_238;
  void *local_230;
  void *local_228;
  int local_220;
  long local_218;
  void *local_210;
  ParamDict pd;
  size_t local_1f8;
  Allocator *local_1e8;
  int iStack_1e0;
  int iStack_1dc;
  undefined8 uStack_1d8;
  int local_1d0 [2];
  size_t local_1c8;
  void *local_1c0;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  size_t local_1b0;
  int local_1a8;
  Allocator *local_1a0;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined8 uStack_190;
  int local_188;
  size_t local_180;
  long local_170;
  long local_168;
  long local_160;
  int TILE_K;
  int TILE_M;
  ulong local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  ulong local_110;
  ParamDict pd_5;
  size_t local_f8;
  Allocator *local_e8;
  int local_e0;
  int iStack_dc;
  undefined8 uStack_d8;
  int local_d0;
  size_t local_c8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  int TILE_N;
  
  if ((this->super_Convolution).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_Convolution).activation_type) {
  case 1:
    pLVar25 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar25->_vptr_Layer[2])(pLVar25,&pd);
    break;
  case 2:
    pLVar25 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    (*pLVar25->_vptr_Layer[2])(pLVar25,&pd);
    break;
  case 3:
    pLVar25 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar25->_vptr_Layer[2])(pLVar25,&pd);
    break;
  case 4:
    pLVar25 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar25->_vptr_Layer[2])(pLVar25,&pd);
    break;
  case 5:
    pLVar25 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar25->_vptr_Layer[2])(pLVar25,&pd);
    break;
  case 6:
    pLVar25 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar25->_vptr_Layer[2])(pLVar25,&pd);
    break;
  default:
    pLVar25 = (Layer *)0x0;
    goto LAB_00172a9f;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar25->_vptr_Layer[4])(pLVar25,opt);
LAB_00172a9f:
  this->activation = pLVar25;
  this->nT = opt->num_threads;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar5 = (this->super_Convolution).kernel_w;
  uVar11 = (this->super_Convolution).kernel_h;
  auVar88._4_4_ = uVar11;
  auVar88._0_4_ = uVar5;
  uVar72 = (long)(this->super_Convolution).weight_data_size / (long)(int)(uVar11 * uVar5);
  uVar30 = (this->super_Convolution).num_output;
  uVar72 = (long)((ulong)(uint)((int)uVar72 >> 0x1f) << 0x20 | uVar72 & 0xffffffff) /
           (long)(int)uVar30;
  _h = (uint)uVar72;
  if (uVar5 == uVar11 && opt->use_packing_layout == false) {
    auVar89._0_4_ = (this->super_Convolution).dilation_w;
    auVar89._4_4_ = (this->super_Convolution).dilation_h;
    auVar89._8_4_ = (this->super_Convolution).stride_w;
    auVar89._12_4_ = (this->super_Convolution).stride_h;
    auVar116._4_4_ = auVar89._0_4_;
    auVar116._0_4_ = auVar89._0_4_;
    auVar116._8_4_ = auVar89._0_4_;
    auVar116._12_4_ = auVar89._0_4_;
    auVar117._8_4_ = 1;
    auVar117._0_8_ = 0x100000001;
    auVar117._12_4_ = 1;
    auVar116 = vpblendd_avx2(auVar117,auVar116,2);
    uVar57 = vpcmpd_avx512vl(auVar89,auVar116,4);
    uVar50 = vpcmpeqd_avx512vl(auVar89,auVar116);
    auVar89 = vpmovm2d_avx512vl(uVar57 & 0xf);
    auVar116 = vpmovm2d_avx512vl(uVar50 & 0xf);
    auVar89 = vpblendd_avx2(auVar116,auVar89,1);
    uVar87 = vpmovd2m_avx512vl(auVar89);
    if ((~(ushort)uVar87 & 0xf) == 0) {
      pLVar25 = create_layer_cpu(6);
      this->convolution_dilation1 = pLVar25;
      ParamDict::ParamDict(&pd_5);
      ParamDict::set(&pd_5,0,(this->super_Convolution).num_output);
      ParamDict::set(&pd_5,1,(this->super_Convolution).kernel_w);
      ParamDict::set(&pd_5,0xb,(this->super_Convolution).kernel_h);
      ParamDict::set(&pd_5,2,1);
      ParamDict::set(&pd_5,0xc,1);
      ParamDict::set(&pd_5,3,1);
      ParamDict::set(&pd_5,0xd,1);
      ParamDict::set(&pd_5,4,0);
      ParamDict::set(&pd_5,0xe,0);
      ParamDict::set(&pd_5,5,(this->super_Convolution).bias_term);
      ParamDict::set(&pd_5,6,(this->super_Convolution).weight_data_size);
      (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
      if ((this->super_Convolution).bias_term == 0) {
        local_1c8 = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_1e8 = (Allocator *)0x0;
        iStack_1e0 = 0;
        iStack_1dc = 0;
        uStack_1d8._0_4_ = 0;
        uStack_1d8._4_4_ = 0;
        local_1d0[0] = 0;
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar8 = (this->super_Convolution).weight_data.refcount;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + 1;
            UNLOCK();
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar8 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar8,0);
          pd.d._4_4_ = (undefined4)((ulong)piVar8 >> 0x20);
          local_1e8 = (this->super_Convolution).weight_data.allocator;
          uVar19 = (this->super_Convolution).weight_data.dims;
          uVar20 = (this->super_Convolution).weight_data.w;
          uStack_1d8._0_4_ = (this->super_Convolution).weight_data.h;
          uStack_1d8._4_4_ = (this->super_Convolution).weight_data.d;
          local_1d0[0] = (this->super_Convolution).weight_data.c;
          local_1c8 = (this->super_Convolution).weight_data.cstep;
          iStack_1e0 = uVar19;
          iStack_1dc = uVar20;
        }
        pLVar25 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar25->_vptr_Layer[3])(pLVar25,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        piVar8 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (local_1e8 == (Allocator *)0x0) {
              free(pd._vptr_ParamDict);
            }
            else {
              (*local_1e8->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        local_1c8 = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_1e8 = (Allocator *)0x0;
        iStack_1e0 = 0;
        iStack_1dc = 0;
        uStack_1d8._0_4_ = 0;
        uStack_1d8._4_4_ = 0;
        local_1d0[0] = 0;
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar8 = (this->super_Convolution).weight_data.refcount;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + 1;
            UNLOCK();
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar8 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar8,0);
          pd.d._4_4_ = (undefined4)((ulong)piVar8 >> 0x20);
          local_1e8 = (this->super_Convolution).weight_data.allocator;
          uVar15 = (this->super_Convolution).weight_data.dims;
          uVar16 = (this->super_Convolution).weight_data.w;
          uStack_1d8._0_4_ = (this->super_Convolution).weight_data.h;
          uStack_1d8._4_4_ = (this->super_Convolution).weight_data.d;
          local_1d0[0] = (this->super_Convolution).weight_data.c;
          local_1c8 = (this->super_Convolution).weight_data.cstep;
          iStack_1e0 = uVar15;
          iStack_1dc = uVar16;
        }
        local_180 = 0;
        local_188 = 0;
        uStack_190 = 0;
        uStack_194 = 0;
        uStack_198 = 0;
        local_1a0 = (Allocator *)0x0;
        local_1a8 = 0;
        local_1b0 = 0;
        uStack_1b4 = 0;
        uStack_1b8 = 0;
        local_1c0 = (void *)0x0;
        if ((Mat *)&local_1c0 != &(this->super_Convolution).bias_data) {
          piVar8 = (this->super_Convolution).bias_data.refcount;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + 1;
            UNLOCK();
          }
          local_1c0 = (this->super_Convolution).bias_data.data;
          piVar8 = (this->super_Convolution).bias_data.refcount;
          uStack_1b8 = SUB84(piVar8,0);
          uStack_1b4 = (undefined4)((ulong)piVar8 >> 0x20);
          local_1b0 = (this->super_Convolution).bias_data.elemsize;
          local_1a8 = (this->super_Convolution).bias_data.elempack;
          local_1a0 = (this->super_Convolution).bias_data.allocator;
          uVar17 = (this->super_Convolution).bias_data.dims;
          uVar18 = (this->super_Convolution).bias_data.w;
          uStack_190._0_4_ = (this->super_Convolution).bias_data.h;
          uStack_190._4_4_ = (this->super_Convolution).bias_data.d;
          local_188 = (this->super_Convolution).bias_data.c;
          local_180 = (this->super_Convolution).bias_data.cstep;
          uStack_198 = uVar17;
          uStack_194 = uVar18;
        }
        pLVar25 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar25->_vptr_Layer[3])(pLVar25,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        lVar85 = 0x48;
        do {
          piVar8 = *(int **)((long)&pd.d + lVar85);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (*(long **)((long)&local_1e8 + lVar85) == (long *)0x0) {
                free(*(void **)((long)&pd._vptr_ParamDict + lVar85));
              }
              else {
                (**(code **)(**(long **)((long)&local_1e8 + lVar85) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_1c8 + lVar85) = 0;
          *(undefined1 (*) [16])((long)&pd.d + lVar85 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar85) = (undefined1  [16])0x0;
          *(undefined4 *)((long)local_1d0 + lVar85) = 0;
          *(undefined1 (*) [16])((long)&iStack_1e0 + lVar85) = (undefined1  [16])0x0;
          lVar85 = lVar85 + -0x48;
        } while (lVar85 != -0x48);
      }
      (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
      if (opt->lightmode == true) {
        piVar8 = (this->super_Convolution).weight_data.refcount;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            pAVar9 = (this->super_Convolution).weight_data.allocator;
            if (pAVar9 == (Allocator *)0x0) {
              free((this->super_Convolution).weight_data.data);
            }
            else {
              (*pAVar9->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Convolution).weight_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Convolution).weight_data.data = (void *)0x0;
        (this->super_Convolution).weight_data.refcount = (int *)0x0;
        (this->super_Convolution).weight_data.dims = 0;
        (this->super_Convolution).weight_data.w = 0;
        (this->super_Convolution).weight_data.h = 0;
        (this->super_Convolution).weight_data.d = 0;
        (this->super_Convolution).weight_data.c = 0;
      }
      ParamDict::~ParamDict(&pd_5);
      return 0;
    }
  }
  if (opt->use_packing_layout == false) {
    uVar75 = 1;
    uVar50 = 1;
  }
  else {
    uVar50 = 0x10;
    uVar75 = 0x10;
    if ((uVar72 & 0xf) != 0) {
      if ((uVar72 & 7) == 0) {
        uVar75 = 8;
      }
      else {
        uVar75 = (uint)((uVar72 & 3) == 0) * 3 + 1;
      }
    }
    if ((uVar30 & 0xf) != 0) {
      if ((uVar30 & 7) == 0) {
        uVar50 = 8;
      }
      else {
        uVar50 = (ulong)((uint)((uVar30 & 3) == 0) * 3 + 1);
      }
    }
  }
  bVar35 = opt->use_winograd23_convolution;
  if ((((bool)bVar35 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar21 = false;
  }
  else {
    bVar21 = 8 < (int)uVar30 || 8 < (int)_h;
  }
  auVar12._0_4_ = (this->super_Convolution).dilation_w;
  auVar12._4_4_ = (this->super_Convolution).dilation_h;
  auVar12._8_4_ = (this->super_Convolution).stride_w;
  auVar12._12_4_ = (this->super_Convolution).stride_h;
  auVar88._8_8_ = 0;
  auVar88 = vpunpcklqdq_avx(auVar88,auVar12);
  if (((auVar88 != _DAT_00539080) || ((this->super_Convolution).stride_w != 1)) ||
     (((this->super_Convolution).stride_h != 1 ||
      ((opt->use_winograd_convolution == false || (!bVar21)))))) {
    iVar83 = get_cpu_level2_cache_size();
    uVar30 = (this->super_Convolution).num_output;
    uVar46 = (this->super_Convolution).kernel_w;
    uVar57 = (ulong)(int)uVar30;
    uVar73 = (this->super_Convolution).kernel_h;
    uVar2 = (this->super_Convolution).dilation_w;
    uVar3 = (this->super_Convolution).dilation_h;
    uVar4 = (this->super_Convolution).stride_w;
    iVar74 = (this->super_Convolution).stride_h;
    if (((opt->use_sgemm_convolution == true) &&
        (iVar83 < (int)(uVar30 * uVar46 * uVar73 * uVar2 * uVar3 * uVar4 * iVar74 * _h * 8) ||
         (0x10 < (int)_h || 0x10 < (int)uVar30))) || (uVar73 == 1 && uVar46 == 1)) {
      uVar73 = uVar73 * uVar46;
      local_140 = (ulong)(_h * uVar73);
      convolution_im2col_gemm_get_optimal_tile_mnk
                (uVar30,0,_h * uVar73,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
      uVar50 = (long)(int)(TILE_M + uVar30 + -1) / (long)TILE_M;
      if (opt->use_packing_layout == true) {
        if ((uVar72 & 0xf) == 0) {
          uVar75 = 0x10;
        }
        else if ((uVar72 & 7) == 0) {
          uVar75 = 8;
        }
        else {
          uVar75 = (uint)((uVar72 & 3) == 0) * 3 + 1;
        }
      }
      else {
        uVar75 = 1;
      }
      local_1c8 = 0;
      this_00 = &(this->super_Convolution).weight_data;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1e8 = (Allocator *)0x0;
      iStack_1e0 = 0;
      iStack_1dc = 0;
      uStack_1d8._0_4_ = 0;
      uStack_1d8._4_4_ = 0;
      local_1d0[0] = 0;
      if (uVar73 == 1) {
        Mat::reshape((Mat *)&pd_5,this_00,(int)local_140,uVar30,(Allocator *)0x0);
        if (pd_5.d != (ParamDictPrivate *)0x0) {
          LOCK();
          (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + 1;
          UNLOCK();
        }
        piVar8 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (local_1e8 == (Allocator *)0x0) {
              free(pd._vptr_ParamDict);
            }
            else {
              (*local_1e8->_vptr_Allocator[3])();
            }
          }
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = SUB84(pd_5.d,0);
        pd.d._4_4_ = (undefined4)((ulong)pd_5.d >> 0x20);
        local_1e8 = local_e8;
        iStack_1e0 = local_e0;
        iStack_1dc = iStack_dc;
        uStack_1d8 = uStack_d8;
        local_1d0[0] = local_d0;
        local_1c8 = local_c8;
        if (pd_5.d == (ParamDictPrivate *)0x0) goto LAB_0017397c;
        LOCK();
        (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + -1;
        UNLOCK();
        if ((pd_5.d)->params[0].type != 0) goto LAB_0017397c;
        if (local_e8 != (Allocator *)0x0) {
          (*local_e8->_vptr_Allocator[3])();
          goto LAB_0017397c;
        }
      }
      else {
        Mat::reshape((Mat *)&pd_5,this_00,uVar73,_h,uVar30,(Allocator *)0x0);
        uVar57 = 0;
        Mat::create((Mat *)&pd,(int)local_140,uVar30,4,(Allocator *)0x0);
        uVar72 = (ulong)uVar73;
        if ((int)uVar73 < 1) {
          uVar72 = uVar57;
        }
        uVar37 = 0;
        if (0 < (int)uVar30) {
          uVar37 = (ulong)uVar30;
        }
        for (; uVar57 != uVar37; uVar57 = uVar57 + 1) {
          pp_Var54 = pd._vptr_ParamDict;
          for (lVar85 = 0; lVar85 < (long)((long)(int)_h - (ulong)(uVar75 - 1));
              lVar85 = lVar85 + (ulong)uVar75) {
            pp_Var62 = (_func_int **)
                       ((iStack_dc * lVar85 + local_c8 * uVar57) * local_f8 +
                       (long)pd_5._vptr_ParamDict);
            for (uVar68 = 0; pp_Var77 = pp_Var62, uVar76 = (ulong)uVar75, uVar68 != uVar72;
                uVar68 = uVar68 + 1) {
              while (uVar76 != 0) {
                *(undefined4 *)pp_Var54 = *(undefined4 *)pp_Var77;
                pp_Var54 = (_func_int **)((long)pp_Var54 + 4);
                pp_Var77 = (_func_int **)((long)pp_Var77 + local_f8 * (long)iStack_dc);
                uVar76 = uVar76 - 1;
              }
              pp_Var62 = (_func_int **)((long)pp_Var62 + 4);
            }
          }
        }
        if (pd_5.d == (ParamDictPrivate *)0x0) goto LAB_0017397c;
        LOCK();
        (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + -1;
        UNLOCK();
        if ((pd_5.d)->params[0].type != 0) goto LAB_0017397c;
        if (local_e8 != (Allocator *)0x0) {
          (*local_e8->_vptr_Allocator[3])();
          goto LAB_0017397c;
        }
      }
      free(pd_5._vptr_ParamDict);
LAB_0017397c:
      uVar72 = local_140;
      iVar83 = TILE_M;
      lVar85 = (long)TILE_M;
      iVar74 = (int)local_140;
      local_170 = 4;
      Mat::create(&this->weight_sgemm_data,TILE_M * TILE_K,(iVar74 + TILE_K + -1) / TILE_K,
                  (int)((uVar30 - 1) + TILE_M) / TILE_M,4,(Allocator *)0x0);
      local_118 = (long)iVar74;
      uVar57 = uVar50 & 0xffffffff;
      if ((int)uVar50 < 1) {
        uVar57 = 0;
      }
      lVar61 = lVar85 * 4;
      local_120 = 0x28;
      local_128 = 0x2c;
      local_130 = 0x30;
      local_138 = 0x34;
      local_68 = 0x38;
      local_70 = 0x3c;
      local_78 = 0x24;
      local_80 = 0x20;
      local_88 = 0x1c;
      local_90 = 0x18;
      local_98 = 0x14;
      local_a0 = 0x10;
      local_a8 = 0xc;
      local_b0 = 8;
      lVar78 = 0;
      for (uVar50 = 0; lVar34 = lVar78, uVar50 != uVar57; uVar50 = uVar50 + 1) {
        uVar37 = uVar50 * lVar85;
        iVar74 = uVar30 - (int)uVar37;
        if (iVar83 < iVar74) {
          iVar74 = iVar83;
        }
        local_160 = (long)TILE_K;
        lVar78 = (long)iVar74;
        local_250 = 0;
        uVar68 = 0;
        while (uVar76 = uVar68, (long)uVar76 < local_118) {
          iVar74 = (int)uVar72 - (int)uVar76;
          if (TILE_K < iVar74) {
            iVar74 = TILE_K;
          }
          sVar10 = (this->weight_sgemm_data).elemsize;
          pauVar63 = (undefined1 (*) [64])
                     ((long)(this->weight_sgemm_data).data +
                     (long)(this->weight_sgemm_data).w * sVar10 *
                     (long)(int)((long)((ulong)(uint)((int)uVar76 >> 0x1f) << 0x20 |
                                       uVar76 & 0xffffffff) / (long)TILE_K) +
                     (long)(int)((long)((ulong)(uint)((int)uVar37 >> 0x1f) << 0x20 |
                                       uVar37 & 0xffffffff) / (long)TILE_M) *
                     (this->weight_sgemm_data).cstep * sVar10);
          lVar38 = (long)iStack_1dc;
          lVar26 = lVar38 * 0x40;
          lVar27 = local_88 * lVar38 + local_250;
          lVar48 = local_90 * lVar38 + local_250;
          lVar58 = local_98 * lVar38 + local_250;
          lVar40 = local_a0 * lVar38 + local_250;
          lVar80 = local_a8 * lVar38 + local_250;
          lVar66 = local_b0 * lVar38 + local_250;
          lVar44 = local_170 * lVar38 + local_250;
          lVar69 = lVar34 * lVar38 + local_250;
          lVar67 = 0;
          lVar45 = lVar44;
          local_2b0 = lVar40;
          local_2a8 = lVar66;
          local_2a0 = lVar80;
          local_288 = lVar48;
          local_280 = lVar69;
          local_278 = lVar58;
          local_218 = lVar27;
          for (uVar72 = 0; (long)(uVar72 | 0xf) < lVar78; uVar72 = uVar72 + 0x10) {
            lVar70 = lVar67 + (long)pd._vptr_ParamDict;
            lVar32 = 0;
            for (iVar42 = 0; iVar42 + 0xf < iVar74; iVar42 = iVar42 + 0x10) {
              auVar93 = *(undefined1 (*) [64])(lVar70 + lVar69);
              auVar94 = *(undefined1 (*) [64])(lVar70 + lVar44);
              auVar95 = *(undefined1 (*) [64])(lVar70 + lVar66);
              auVar96 = *(undefined1 (*) [64])(lVar70 + lVar80);
              auVar97 = *(undefined1 (*) [64])(lVar70 + lVar40);
              auVar98 = *(undefined1 (*) [64])(lVar70 + lVar58);
              auVar99 = *(undefined1 (*) [64])(lVar70 + lVar48);
              auVar100 = *(undefined1 (*) [64])(lVar70 + lVar27);
              auVar101 = *(undefined1 (*) [64])(lVar70 + local_80 * lVar38 + local_250);
              auVar102 = *(undefined1 (*) [64])(lVar70 + local_78 * lVar38 + local_250);
              auVar103 = *(undefined1 (*) [64])(lVar70 + local_120 * lVar38 + local_250);
              auVar104 = *(undefined1 (*) [64])(lVar70 + local_128 * lVar38 + local_250);
              auVar105 = *(undefined1 (*) [64])(lVar70 + local_130 * lVar38 + local_250);
              auVar106 = *(undefined1 (*) [64])(lVar70 + local_138 * lVar38 + local_250);
              auVar107 = *(undefined1 (*) [64])(lVar70 + local_68 * lVar38 + local_250);
              auVar108 = *(undefined1 (*) [64])(lVar70 + local_70 * lVar38 + local_250);
              auVar92 = vunpcklps_avx512f(auVar93,auVar94);
              auVar93 = vunpckhps_avx512f(auVar93,auVar94);
              auVar94 = vunpcklps_avx512f(auVar95,auVar96);
              auVar95 = vunpckhps_avx512f(auVar95,auVar96);
              auVar96 = vunpcklps_avx512f(auVar97,auVar98);
              auVar97 = vunpckhps_avx512f(auVar97,auVar98);
              auVar98 = vunpcklps_avx512f(auVar99,auVar100);
              auVar99 = vunpckhps_avx512f(auVar99,auVar100);
              auVar100 = vunpcklps_avx512f(auVar101,auVar102);
              auVar101 = vunpckhps_avx512f(auVar101,auVar102);
              auVar102 = vunpcklps_avx512f(auVar103,auVar104);
              auVar103 = vunpckhps_avx512f(auVar103,auVar104);
              auVar104 = vunpcklps_avx512f(auVar105,auVar106);
              auVar105 = vunpckhps_avx512f(auVar105,auVar106);
              auVar106 = vunpcklps_avx512f(auVar107,auVar108);
              auVar107 = vunpckhps_avx512f(auVar107,auVar108);
              auVar108 = vunpcklpd_avx512f(auVar92,auVar94);
              auVar94 = vunpckhpd_avx512f(auVar92,auVar94);
              auVar92 = vunpcklpd_avx512f(auVar93,auVar95);
              auVar93 = vunpckhpd_avx512f(auVar93,auVar95);
              auVar95 = vunpcklpd_avx512f(auVar96,auVar98);
              auVar96 = vunpckhpd_avx512f(auVar96,auVar98);
              auVar98 = vunpcklpd_avx512f(auVar97,auVar99);
              auVar97 = vunpckhpd_avx512f(auVar97,auVar99);
              auVar99 = vunpcklpd_avx512f(auVar100,auVar102);
              auVar100 = vunpckhpd_avx512f(auVar100,auVar102);
              auVar102 = vunpcklpd_avx512f(auVar101,auVar103);
              auVar101 = vunpckhpd_avx512f(auVar101,auVar103);
              auVar103 = vunpcklpd_avx512f(auVar104,auVar106);
              auVar104 = vunpckhpd_avx512f(auVar104,auVar106);
              auVar106 = vunpcklpd_avx512f(auVar105,auVar107);
              auVar105 = vunpckhpd_avx512f(auVar105,auVar107);
              auVar107 = vshuff64x2_avx512f(auVar108,auVar95,0x88);
              auVar109 = vshuff64x2_avx512f(auVar99,auVar103,0x88);
              auVar110 = vshuff64x2_avx512f(auVar94,auVar96,0x88);
              auVar111 = vshuff64x2_avx512f(auVar100,auVar104,0x88);
              auVar112 = vshuff64x2_avx512f(auVar92,auVar98,0x88);
              auVar113 = vshuff64x2_avx512f(auVar102,auVar106,0x88);
              auVar114 = vshuff64x2_avx512f(auVar93,auVar97,0x88);
              auVar115 = vshuff64x2_avx512f(auVar101,auVar105,0x88);
              auVar95 = vshuff64x2_avx512f(auVar108,auVar95,0xdd);
              auVar99 = vshuff64x2_avx512f(auVar99,auVar103,0xdd);
              auVar94 = vshuff64x2_avx512f(auVar94,auVar96,0xdd);
              auVar96 = vshuff64x2_avx512f(auVar100,auVar104,0xdd);
              auVar98 = vshuff64x2_avx512f(auVar92,auVar98,0xdd);
              auVar100 = vshuff64x2_avx512f(auVar102,auVar106,0xdd);
              auVar93 = vshuff64x2_avx512f(auVar93,auVar97,0xdd);
              auVar97 = vshuff64x2_avx512f(auVar101,auVar105,0xdd);
              auVar101 = vshuff64x2_avx512f(auVar107,auVar109,0x88);
              auVar102 = vshuff64x2_avx512f(auVar110,auVar111,0x88);
              auVar103 = vshuff64x2_avx512f(auVar112,auVar113,0x88);
              auVar104 = vshuff64x2_avx512f(auVar114,auVar115,0x88);
              auVar105 = vshuff64x2_avx512f(auVar95,auVar99,0x88);
              auVar106 = vshuff64x2_avx512f(auVar94,auVar96,0x88);
              auVar108 = vshuff64x2_avx512f(auVar98,auVar100,0x88);
              auVar92 = vshuff64x2_avx512f(auVar93,auVar97,0x88);
              auVar107 = vshuff64x2_avx512f(auVar107,auVar109,0xdd);
              auVar109 = vshuff64x2_avx512f(auVar110,auVar111,0xdd);
              auVar110 = vshuff64x2_avx512f(auVar112,auVar113,0xdd);
              auVar111 = vshuff64x2_avx512f(auVar114,auVar115,0xdd);
              auVar95 = vshuff64x2_avx512f(auVar95,auVar99,0xdd);
              auVar94 = vshuff64x2_avx512f(auVar94,auVar96,0xdd);
              auVar96 = vshuff64x2_avx512f(auVar98,auVar100,0xdd);
              auVar93 = vshuff64x2_avx512f(auVar93,auVar97,0xdd);
              *pauVar63 = auVar101;
              pauVar63[1] = auVar102;
              pauVar63[2] = auVar103;
              pauVar63[3] = auVar104;
              pauVar63[4] = auVar105;
              pauVar63[5] = auVar106;
              pauVar63[6] = auVar108;
              pauVar63[7] = auVar92;
              pauVar63[8] = auVar107;
              pauVar63[9] = auVar109;
              pauVar63[10] = auVar110;
              pauVar63[0xb] = auVar111;
              pauVar63[0xc] = auVar95;
              pauVar63[0xd] = auVar94;
              pauVar63[0xe] = auVar96;
              pauVar63[0xf] = auVar93;
              pauVar63 = pauVar63 + 0x10;
              lVar70 = lVar70 + 0x40;
              lVar32 = lVar32 + 0x10;
            }
            for (; (int)lVar32 < iVar74; lVar32 = lVar32 + 1) {
              puVar71 = (undefined4 *)((long)pd._vptr_ParamDict + lVar32 * 4 + local_280);
              *(undefined4 *)*pauVar63 = *puVar71;
              *(undefined4 *)(*pauVar63 + 4) = puVar71[lVar38];
              *(undefined4 *)(*pauVar63 + 8) = puVar71[lVar38 * 2];
              *(undefined4 *)(*pauVar63 + 0xc) = puVar71[lVar38 * 3];
              *(undefined4 *)(*pauVar63 + 0x10) = puVar71[lVar38 * 4];
              *(undefined4 *)(*pauVar63 + 0x14) = puVar71[lVar38 * 5];
              *(undefined4 *)(*pauVar63 + 0x18) = puVar71[lVar38 * 6];
              *(undefined4 *)(*pauVar63 + 0x1c) = puVar71[lVar38 * 7];
              *(undefined4 *)(*pauVar63 + 0x20) = puVar71[lVar38 * 8];
              *(undefined4 *)(*pauVar63 + 0x24) = puVar71[lVar38 * 9];
              *(undefined4 *)(*pauVar63 + 0x28) = puVar71[lVar38 * 10];
              *(undefined4 *)(*pauVar63 + 0x2c) = puVar71[lVar38 * 0xb];
              *(undefined4 *)(*pauVar63 + 0x30) = puVar71[lVar38 * 0xc];
              *(undefined4 *)(*pauVar63 + 0x34) = puVar71[lVar38 * 0xd];
              *(undefined4 *)(*pauVar63 + 0x38) = puVar71[lVar38 * 0xe];
              *(undefined4 *)(*pauVar63 + 0x3c) = puVar71[lVar38 * 0xf];
              pauVar63 = pauVar63 + 1;
            }
            lVar67 = lVar67 + lVar26;
            local_280 = local_280 + lVar26;
            lVar45 = lVar45 + lVar26;
            local_2a8 = local_2a8 + lVar26;
            local_2a0 = local_2a0 + lVar26;
            local_2b0 = local_2b0 + lVar26;
            local_278 = local_278 + lVar26;
            local_288 = local_288 + lVar26;
            local_218 = local_218 + lVar26;
          }
          lVar26 = lVar38 * 0x20;
          for (; (long)(uVar72 | 7) < lVar78; uVar72 = uVar72 + 8) {
            lVar40 = 0;
            lVar27 = 0;
            pauVar33 = pauVar63;
            for (iVar42 = 0; iVar42 + 7 < iVar74; iVar42 = iVar42 + 8) {
              auVar90 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + local_280);
              auVar91 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + lVar45);
              auVar118 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + local_2a8);
              auVar120 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + local_2a0);
              auVar121 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + local_2b0);
              auVar123 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + local_278);
              auVar122 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + local_288);
              auVar124 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + local_218);
              auVar14 = vunpcklps_avx(auVar90,auVar91);
              auVar91 = vunpckhps_avx(auVar90,auVar91);
              auVar90 = vunpcklps_avx(auVar118,auVar120);
              auVar118 = vunpckhps_avx(auVar118,auVar120);
              auVar119 = vunpcklps_avx(auVar121,auVar123);
              auVar120 = vunpckhps_avx(auVar121,auVar123);
              auVar125 = vunpcklps_avx(auVar122,auVar124);
              auVar121 = vunpckhps_avx(auVar122,auVar124);
              auVar123 = vunpcklpd_avx(auVar14,auVar90);
              auVar90 = vunpckhpd_avx(auVar14,auVar90);
              auVar122 = vunpcklpd_avx(auVar91,auVar118);
              auVar91 = vunpckhpd_avx(auVar91,auVar118);
              auVar124 = vunpcklpd_avx(auVar119,auVar125);
              auVar118 = vunpckhpd_avx(auVar119,auVar125);
              auVar14 = vunpcklpd_avx(auVar120,auVar121);
              auVar120 = vunpckhpd_avx(auVar120,auVar121);
              auVar119._16_16_ = auVar124._0_16_;
              auVar119._0_16_ = auVar123._0_16_;
              auVar125._16_16_ = auVar118._0_16_;
              auVar125._0_16_ = auVar90._0_16_;
              auVar128._16_16_ = auVar14._0_16_;
              auVar128._0_16_ = auVar122._0_16_;
              auVar127._16_16_ = auVar120._0_16_;
              auVar127._0_16_ = auVar91._0_16_;
              auVar121 = vperm2f128_avx(auVar123,auVar124,0x31);
              auVar90 = vperm2f128_avx(auVar90,auVar118,0x31);
              auVar118 = vperm2f128_avx(auVar122,auVar14,0x31);
              auVar91 = vperm2f128_avx(auVar91,auVar120,0x31);
              *(undefined1 (*) [32])(*pauVar63 + lVar27 * 8) = auVar119;
              *(undefined1 (*) [32])(*pauVar63 + lVar27 * 8 + 0x20) = auVar125;
              *(undefined1 (*) [32])(pauVar63[1] + lVar27 * 8) = auVar128;
              *(undefined1 (*) [32])(pauVar63[1] + lVar27 * 8 + 0x20) = auVar127;
              *(undefined1 (*) [32])(pauVar63[2] + lVar27 * 8) = auVar121;
              *(undefined1 (*) [32])(pauVar63[2] + lVar27 * 8 + 0x20) = auVar90;
              *(undefined1 (*) [32])(pauVar63[3] + lVar27 * 8) = auVar118;
              *(undefined1 (*) [32])(pauVar63[3] + lVar27 * 8 + 0x20) = auVar91;
              pauVar33 = pauVar33 + 4;
              lVar27 = lVar27 + 0x20;
              lVar40 = lVar40 + 8;
            }
            for (; (int)lVar40 < iVar74; lVar40 = lVar40 + 1) {
              puVar71 = (undefined4 *)((long)pd._vptr_ParamDict + lVar40 * 4 + local_280);
              *(undefined4 *)*pauVar33 = *puVar71;
              *(undefined4 *)(*pauVar33 + 4) = puVar71[lVar38];
              *(undefined4 *)(*pauVar33 + 8) = puVar71[lVar38 * 2];
              *(undefined4 *)(*pauVar33 + 0xc) = puVar71[lVar38 * 3];
              *(undefined4 *)(*pauVar33 + 0x10) = puVar71[lVar38 * 4];
              *(undefined4 *)(*pauVar33 + 0x14) = puVar71[lVar38 * 5];
              *(undefined4 *)(*pauVar33 + 0x18) = puVar71[lVar38 * 6];
              *(undefined4 *)(*pauVar33 + 0x1c) = puVar71[lVar38 * 7];
              pauVar33 = (undefined1 (*) [64])(*pauVar33 + 0x20);
            }
            local_280 = local_280 + lVar26;
            lVar45 = lVar45 + lVar26;
            local_2a8 = local_2a8 + lVar26;
            local_2a0 = local_2a0 + lVar26;
            local_2b0 = local_2b0 + lVar26;
            local_278 = local_278 + lVar26;
            local_288 = local_288 + lVar26;
            local_218 = local_218 + lVar26;
            pauVar63 = pauVar33;
          }
          lVar26 = lVar38 * 0x10;
          for (; (long)(uVar72 | 3) < lVar78; uVar72 = uVar72 + 4) {
            lVar27 = 0;
            pauVar33 = pauVar63;
            for (iVar42 = 0; iVar42 + 7 < iVar74; iVar42 = iVar42 + 8) {
              auVar90 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + local_280);
              auVar91 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + lVar45);
              auVar118 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + local_2a8);
              auVar120 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + local_2a0);
              auVar121 = vunpcklps_avx(auVar90,auVar91);
              auVar91 = vunpckhps_avx(auVar90,auVar91);
              auVar90 = vunpcklps_avx(auVar118,auVar120);
              auVar118 = vunpckhps_avx(auVar118,auVar120);
              auVar120 = vunpcklpd_avx(auVar121,auVar90);
              auVar90 = vunpckhpd_avx(auVar121,auVar90);
              auVar121 = vunpcklpd_avx(auVar91,auVar118);
              auVar91 = vunpckhpd_avx(auVar91,auVar118);
              auVar118._16_16_ = auVar90._0_16_;
              auVar118._0_16_ = auVar120._0_16_;
              auVar123._16_16_ = auVar91._0_16_;
              auVar123._0_16_ = auVar121._0_16_;
              auVar90 = vperm2f128_avx(auVar120,auVar90,0x31);
              auVar91 = vperm2f128_avx(auVar121,auVar91,0x31);
              *(undefined1 (*) [32])(*pauVar63 + lVar27 * 4) = auVar118;
              *(undefined1 (*) [32])(*pauVar63 + lVar27 * 4 + 0x20) = auVar123;
              *(undefined1 (*) [32])(pauVar63[1] + lVar27 * 4) = auVar90;
              *(undefined1 (*) [32])(pauVar63[1] + lVar27 * 4 + 0x20) = auVar91;
              pauVar33 = pauVar33 + 2;
              lVar27 = lVar27 + 0x20;
            }
            for (; iVar42 + 3 < iVar74; iVar42 = iVar42 + 4) {
              auVar88 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar27 + local_280);
              auVar89 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar27 + lVar45);
              auVar116 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar27 + local_2a8);
              auVar117 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar27 + local_2a0);
              auVar12 = vpunpckldq_avx(auVar88,auVar89);
              auVar13 = vpunpckldq_avx(auVar116,auVar117);
              auVar88 = vpunpckhdq_avx(auVar88,auVar89);
              auVar89 = vpunpckhdq_avx(auVar116,auVar117);
              auVar117 = vpunpcklqdq_avx(auVar12,auVar13);
              auVar116 = vpunpckhqdq_avx(auVar12,auVar13);
              auVar12 = vpunpcklqdq_avx(auVar88,auVar89);
              auVar88 = vpunpckhqdq_avx(auVar88,auVar89);
              *(undefined1 (*) [16])(*pauVar63 + lVar27 * 4) = auVar117;
              *(undefined1 (*) [16])(*pauVar63 + lVar27 * 4 + 0x10) = auVar116;
              *(undefined1 (*) [16])(*pauVar63 + lVar27 * 4 + 0x20) = auVar12;
              *(undefined1 (*) [16])(*pauVar63 + lVar27 * 4 + 0x30) = auVar88;
              pauVar33 = pauVar33 + 1;
              lVar27 = lVar27 + 0x10;
            }
            for (; iVar42 < iVar74; iVar42 = iVar42 + 1) {
              *(undefined4 *)(*pauVar63 + lVar27 * 4) =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar27 + local_280);
              *(undefined4 *)(*pauVar63 + lVar27 * 4 + 4) =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar27 + lVar45);
              *(undefined4 *)(*pauVar63 + lVar27 * 4 + 8) =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar27 + local_2a8);
              *(undefined4 *)(*pauVar63 + lVar27 * 4 + 0xc) =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar27 + local_2a0);
              pauVar33 = (undefined1 (*) [64])(*pauVar33 + 0x10);
              lVar27 = lVar27 + 4;
            }
            local_280 = local_280 + lVar26;
            lVar45 = lVar45 + lVar26;
            local_2a8 = local_2a8 + lVar26;
            local_2a0 = local_2a0 + lVar26;
            pauVar63 = pauVar33;
          }
          for (; (long)(uVar72 | 1) < lVar78; uVar72 = uVar72 + 2) {
            lVar26 = 0;
            lVar27 = 0;
            pauVar33 = pauVar63;
            for (iVar42 = 0; iVar42 + 7 < iVar74; iVar42 = iVar42 + 8) {
              auVar90 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + local_280);
              auVar91 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar27 + lVar45);
              auVar118 = vunpcklps_avx(auVar90,auVar91);
              auVar90 = vunpckhps_avx(auVar90,auVar91);
              auVar91._16_16_ = auVar90._0_16_;
              auVar91._0_16_ = auVar118._0_16_;
              auVar90 = vperm2f128_avx(auVar118,auVar90,0x31);
              *(undefined1 (*) [32])(*pauVar63 + lVar27 * 2) = auVar91;
              *(undefined1 (*) [32])(*pauVar63 + lVar27 * 2 + 0x20) = auVar90;
              pauVar33 = pauVar33 + 1;
              lVar27 = lVar27 + 0x20;
              lVar26 = lVar26 + 8;
            }
            for (; iVar42 + 3 < iVar74; iVar42 = iVar42 + 4) {
              auVar88 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar27 + local_280);
              auVar89 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar27 + lVar45);
              auVar116 = vpunpckldq_avx(auVar88,auVar89);
              auVar88 = vpunpckhdq_avx(auVar88,auVar89);
              *(undefined1 (*) [16])(*pauVar63 + lVar27 * 2) = auVar116;
              *(undefined1 (*) [16])(*pauVar63 + lVar27 * 2 + 0x10) = auVar88;
              pauVar33 = (undefined1 (*) [64])(*pauVar33 + 0x20);
              lVar27 = lVar27 + 0x10;
              lVar26 = lVar26 + 4;
            }
            for (; (int)lVar26 < iVar74; lVar26 = lVar26 + 1) {
              *(undefined4 *)*pauVar33 =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar26 * 4 + local_280);
              *(undefined4 *)(*pauVar33 + 4) =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar26 * 4 + lVar45);
              pauVar33 = (undefined1 (*) [64])(*pauVar33 + 8);
            }
            local_280 = local_280 + lVar38 * 8;
            lVar45 = lVar45 + lVar38 * 8;
            pauVar63 = pauVar33;
          }
          for (; (long)uVar72 < lVar78; uVar72 = uVar72 + 1) {
            pauVar49 = (undefined1 (*) [32])
                       ((long)pd._vptr_ParamDict + uVar76 * 4 + (uVar37 + uVar72) * lVar38 * 4);
            lVar45 = 0;
            for (iVar42 = 0; iVar42 + 7 < iVar74; iVar42 = iVar42 + 8) {
              *(undefined1 (*) [32])*pauVar63 = *pauVar49;
              pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x20);
              pauVar49 = pauVar49 + 1;
              lVar45 = lVar45 + 8;
            }
            for (; iVar42 + 3 < iVar74; iVar42 = iVar42 + 4) {
              *(undefined1 (*) [16])*pauVar63 = *(undefined1 (*) [16])*pauVar49;
              pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x10);
              pauVar49 = (undefined1 (*) [32])(*pauVar49 + 0x10);
              lVar45 = lVar45 + 4;
            }
            for (; (int)lVar45 < iVar74; lVar45 = lVar45 + 1) {
              *(undefined4 *)*pauVar63 =
                   *(undefined4 *)((long)pd._vptr_ParamDict + lVar45 * 4 + local_280);
              pauVar63 = (undefined1 (*) [64])(*pauVar63 + 4);
            }
            local_280 = local_280 + lVar38 * 4;
          }
          local_250 = local_250 + local_160 * 4;
          uVar72 = local_140;
          local_110 = uVar76;
          uVar68 = uVar76 + local_160;
        }
        local_120 = local_120 + lVar61;
        local_128 = local_128 + lVar61;
        local_130 = local_130 + lVar61;
        local_138 = local_138 + lVar61;
        local_68 = local_68 + lVar61;
        local_70 = local_70 + lVar61;
        local_78 = local_78 + lVar61;
        local_80 = local_80 + lVar61;
        local_88 = local_88 + lVar61;
        local_90 = local_90 + lVar61;
        local_98 = local_98 + lVar61;
        local_a0 = local_a0 + lVar61;
        local_a8 = local_a8 + lVar61;
        local_b0 = local_b0 + lVar61;
        local_170 = local_170 + lVar61;
        lVar78 = lVar34 + lVar61;
        local_168 = lVar34;
      }
      piVar8 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_1e8 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_1e8->_vptr_Allocator[3])();
          }
        }
      }
      if (opt->lightmode != true) {
        return 0;
      }
      piVar8 = (this->super_Convolution).weight_data.refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          pAVar9 = (this->super_Convolution).weight_data.allocator;
          if (pAVar9 == (Allocator *)0x0) {
            free((this->super_Convolution).weight_data.data);
          }
          else {
            (*pAVar9->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_Convolution).weight_data.cstep = 0;
      *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
           (undefined1  [16])0x0;
      this_00->data = (void *)0x0;
      this_00->refcount = (int *)0x0;
      (this->super_Convolution).weight_data.dims = 0;
      (this->super_Convolution).weight_data.w = 0;
      (this->super_Convolution).weight_data.h = 0;
      (this->super_Convolution).weight_data.d = 0;
      (this->super_Convolution).weight_data.c = 0;
      return 0;
    }
    uVar51 = (uint)uVar50;
    uVar56 = uVar73 ^ 3;
    uVar52 = uVar2 ^ 1;
    local_298._0_4_ = uVar3 ^ 1;
    if (((((uVar75 == 0x10 && uVar51 == 1) && uVar46 == 3) && (uVar52 == 0 && uVar56 == 0)) &&
        ((uVar4 ^ 1) == 0 && (uVar3 ^ 1) == 0)) && iVar74 == 1) {
LAB_00173353:
      uVar73 = uVar73 * uVar46;
      uVar37 = 0;
      Mat::reshape((Mat *)&pd,&(this->super_Convolution).weight_data,uVar73,_h,uVar30,
                   (Allocator *)0x0);
      Mat::create(&this->weight_data_tm,uVar73,(int)_h / (int)uVar75,(int)uVar30 / (int)uVar51,
                  (ulong)(uVar51 * uVar75 * 4),uVar51 * uVar75,(Allocator *)0x0);
      pvVar82 = (this->weight_data_tm).data;
      sVar10 = (this->weight_data_tm).elemsize;
      sVar7 = (this->weight_data_tm).cstep;
      uVar72 = (ulong)uVar73;
      if ((int)uVar73 < 1) {
        uVar72 = uVar37;
      }
      for (; (long)uVar37 < (long)(uVar57 - (uVar51 - 1)); uVar37 = uVar37 + uVar50) {
        puVar71 = (undefined4 *)
                  ((long)(int)((long)((ulong)(uint)((int)uVar37 >> 0x1f) << 0x20 |
                                     uVar37 & 0xffffffff) / (long)(int)uVar51) * sVar10 * sVar7 +
                  (long)pvVar82);
        for (lVar85 = 0; lVar85 < (long)((long)(int)_h - (ulong)(uVar75 - 1));
            lVar85 = lVar85 + (ulong)uVar75) {
          lVar61 = 0;
          for (uVar68 = 0; uVar68 != uVar72; uVar68 = uVar68 + 1) {
            lVar78 = lVar85;
            for (uVar76 = 0; uVar76 != uVar75; uVar76 = uVar76 + 1) {
              puVar43 = (undefined4 *)
                        ((long)pd._vptr_ParamDict +
                        (iStack_1dc * lVar78 + uVar37 * local_1c8) * local_1f8 + lVar61);
              uVar47 = uVar50;
              while (bVar21 = uVar47 != 0, uVar47 = uVar47 - 1, bVar21) {
                *puVar71 = *puVar43;
                puVar71 = puVar71 + 1;
                puVar43 = (undefined4 *)((long)puVar43 + local_1f8 * local_1c8);
              }
              lVar78 = lVar78 + 1;
            }
            lVar61 = lVar61 + 4;
          }
        }
      }
      piVar8 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_1e8 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_1e8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_238._0_4_ = uVar46 ^ 3;
      bVar21 = uVar75 == 8 && (uVar51 ^ 8) == 0;
      if ((iVar74 == 1 &&
           ((uVar3 == 1 && uVar4 == 1) && ((uVar73 == 3 && uVar2 == 1) && (uVar46 == 3 && bVar21))))
         || (iVar74 == 1 &&
             ((uVar3 == 1 && uVar4 == 1) && ((uVar73 == 2 && uVar2 == 1) && (bVar21 && uVar46 == 2))
             ))) goto LAB_00173353;
      bVar21 = ((((uVar51 ^ 8) == 0 && (uVar75 ^ 1) == 0) && (uint)local_238 == 0) &&
               (uVar52 == 0 && uVar56 == 0)) && (uint)local_298 == 0;
      if (((uVar4 == 1 && bVar21) && iVar74 == 1) ||
         (((bVar21 && uVar4 == 2) && iVar74 == 2 ||
          (((((uVar75 == 8 && uVar51 == 1) && (uint)local_238 == 0) && (uVar52 == 0 && uVar56 == 0))
           && ((uVar4 ^ 1) == 0 && (uVar3 ^ 1) == 0)) && iVar74 == 1)))) goto LAB_00173353;
      bVar21 = ((((uVar75 ^ 1) == 0 && uVar51 == 4) && (uint)local_238 == 0) &&
               (uVar52 == 0 && uVar56 == 0)) && (uint)local_298 == 0;
      if (((uVar4 == 1 && bVar21) && iVar74 == 1) || (bVar21 && (uVar4 == 2 && iVar74 == 2)))
      goto LAB_00173353;
      uVar73 = uVar73 * uVar46;
      uVar75 = _h;
      if ((int)uVar30 < 0x10) {
        if (7 < (int)uVar30) {
          if ((int)_h < 0x10) {
            if ((int)_h < 8) {
              if (3 < (int)_h) {
                uVar46 = uVar73 * 0x20;
                uVar75 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
                goto LAB_00174d21;
              }
              if ((int)_h < 2) {
                uVar30 = (uVar30 & 1) + 1 + ((uint)(uVar57 >> 2) & 1) +
                         (uint)((uVar30 >> 1 & 1) != 0);
                uVar46 = uVar73 * 8;
                goto LAB_00175088;
              }
              uVar46 = uVar73 * 0x10;
              uVar75 = (_h & 1) + 1;
            }
            else {
              uVar46 = uVar73 * 0x40;
              uVar75 = (_h & 1) + 1 + (_h >> 2 & 1) + (uint)((_h >> 1 & 1) != 0);
            }
            uVar30 = (uVar30 & 1) + 1 + (uVar30 >> 2 & 1) + (uint)((uVar30 >> 1 & 1) != 0);
          }
          else {
            uVar46 = uVar73 * 0x80;
            uVar75 = (_h & 1) + (_h >> 4) + (uint)((_h >> 3 & 1) != 0) + (_h >> 2 & 1) +
                     (uint)((_h >> 1 & 1) != 0);
LAB_00174d21:
            uVar30 = (uVar30 & 1) + 1 + ((uint)(uVar57 >> 2) & 1) + (uint)((uVar30 >> 1 & 1) != 0);
          }
          goto LAB_00175088;
        }
        if (3 < (int)uVar30) {
          if ((int)_h < 0x10) {
            if ((int)_h < 8) {
              if ((int)_h < 4) {
                if ((int)_h < 2) {
                  uVar46 = uVar73 * 4;
                  uVar30 = (uVar30 & 1) + 1 + (uint)((uVar30 >> 1 & 1) != 0);
                  goto LAB_00175088;
                }
                uVar46 = uVar73 * 8;
                uVar75 = (_h & 1) + 1;
              }
              else {
                uVar46 = uVar73 * 0x10;
                uVar75 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
              }
            }
            else {
              uVar46 = uVar73 * 0x20;
              uVar75 = (_h & 1) + 1 + (_h >> 2 & 1) + (uint)((_h >> 1 & 1) != 0);
            }
          }
          else {
            uVar46 = uVar73 * 0x40;
            uVar75 = (_h & 1) + (_h >> 4) + (uint)((_h >> 3 & 1) != 0) + (_h >> 2 & 1) +
                     (uint)((_h >> 1 & 1) != 0);
          }
          uVar30 = (uVar30 & 1) + 1 + (uint)((uVar30 >> 1 & 1) != 0);
          goto LAB_00175088;
        }
        if ((int)uVar30 < 2) {
          if ((int)_h < 0x10) {
            if (7 < (int)_h) {
              iVar74 = uVar73 * 8;
              uVar75 = (_h & 1) + 1 + (_h >> 2 & 1) + (uint)((_h >> 1 & 1) != 0);
              goto LAB_001768f5;
            }
            if ((int)_h < 4) {
              uVar46 = uVar73;
              if (1 < (int)_h) {
                iVar74 = uVar73 * 2;
                uVar75 = (_h & 1) + 1;
                goto LAB_001768f5;
              }
            }
            else {
              uVar46 = uVar73 * 4;
              uVar75 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
            }
          }
          else {
            uVar46 = uVar73 * 0x10;
            uVar75 = (_h & 1) + (_h >> 4) + (uint)((_h >> 3 & 1) != 0) + (_h >> 2 & 1) +
                     (uint)((_h >> 1 & 1) != 0);
          }
          goto LAB_00175088;
        }
        if ((int)_h < 0x10) {
          if ((int)_h < 8) {
            if (3 < (int)_h) {
              iVar74 = uVar73 * 8;
              uVar75 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
              goto LAB_0017503f;
            }
            if ((int)_h < 2) {
              iVar74 = uVar73 * 2;
              uVar30 = (uVar30 & 1) + 1;
              goto LAB_001768f5;
            }
            uVar46 = uVar73 * 4;
            uVar75 = (_h & 1) + 1;
          }
          else {
            uVar46 = uVar73 * 0x10;
            uVar75 = (_h & 1) + 1 + (_h >> 2 & 1) + (uint)((_h >> 1 & 1) != 0);
          }
          uVar30 = (uVar30 & 1) + 1;
          goto LAB_00175088;
        }
        iVar74 = uVar73 * 0x20;
        uVar75 = (_h & 1) + (_h >> 4) + (uint)((_h >> 3 & 1) != 0) + (_h >> 2 & 1) +
                 (uint)((_h >> 1 & 1) != 0);
LAB_0017503f:
        uVar30 = (uVar30 & 1) + 1;
LAB_001768f5:
        Mat::create(&this->weight_data_tm,iVar74,uVar75,uVar30,4,(Allocator *)0x0);
      }
      else {
        if ((int)_h < 0x10) {
          if ((int)_h < 8) {
            if (3 < (int)_h) {
              uVar46 = uVar73 * 0x40;
              uVar75 = (_h & 1) + 1 + (uint)((_h >> 1 & 1) != 0);
              goto LAB_00173324;
            }
            if ((int)_h < 2) {
              uVar46 = uVar73 * 0x10;
              uVar30 = (uVar30 & 1) + (uVar30 >> 4) + (uint)((uVar30 >> 3 & 1) != 0) +
                       (uVar30 >> 2 & 1) + (uint)((uVar30 >> 1 & 1) != 0);
              goto LAB_00175088;
            }
            uVar46 = uVar73 * 0x20;
            uVar75 = (_h & 1) + 1;
          }
          else {
            uVar46 = uVar73 * 0x80;
            uVar75 = (_h & 1) + 1 + (_h >> 2 & 1) + (uint)((_h >> 1 & 1) != 0);
          }
          uVar30 = (uVar30 & 1) + ((uint)(uVar57 >> 4) & 0xfffffff) + (uint)((uVar30 >> 3 & 1) != 0)
                   + ((uint)(uVar57 >> 2) & 1) + (uint)((uVar30 >> 1 & 1) != 0);
        }
        else {
          uVar46 = uVar73 * 0x100;
          uVar75 = (_h & 1) + (_h >> 4) + (uint)((_h >> 3 & 1) != 0) + (_h >> 2 & 1) +
                   (uint)((_h >> 1 & 1) != 0);
LAB_00173324:
          uVar30 = (uVar30 & 1) + (uVar30 >> 4) + (uint)((uVar30 >> 3 & 1) != 0) + (uVar30 >> 2 & 1)
                   + (uint)((uVar30 >> 1 & 1) != 0);
        }
LAB_00175088:
        Mat::create(&this->weight_data_tm,uVar46,uVar75,uVar30,4,(Allocator *)0x0);
      }
      auVar93 = vpbroadcastd_avx512f();
      auVar93 = vpmulld_avx512f(auVar93,_DAT_00539800);
      auVar94 = vpbroadcastd_avx512f();
      vpmulld_avx512f(auVar93,auVar94);
      lVar85 = (long)(int)uVar73;
      iVar74 = 0;
      uVar72 = 0;
      if (0 < (int)uVar73) {
        uVar72 = (ulong)uVar73;
      }
      iVar60 = uVar73 * _h;
      iVar65 = iVar60 * 0x10;
      local_138 = CONCAT44(local_138._4_4_,iVar65);
      iVar83 = iVar60 * 3;
      local_268 = iVar60 * 2;
      iVar42 = iVar60 * 7;
      local_270 = iVar60 * 6;
      local_248 = iVar60 * 5;
      local_220 = iVar60 * 4;
      lVar45 = (long)(int)(uVar73 * 0x10) * 4;
      lVar26 = (long)(int)(uVar73 * 8) * 4;
      lVar34 = lVar85 * 4;
      lVar27 = (long)(int)(uVar73 * 4) * 4;
      lVar78 = (long)(int)(uVar73 * 2) * 4;
      iVar84 = iVar60 * 0xf;
      iVar24 = iVar60 * 0xe;
      local_160 = CONCAT44(local_160._4_4_,iVar60 * 0xd);
      local_110 = CONCAT44(local_110._4_4_,iVar60 * 0xc);
      local_168 = CONCAT44(local_168._4_4_,iVar60 * 0xb);
      local_170 = CONCAT44(local_170._4_4_,iVar60 * 10);
      local_118 = CONCAT44(local_118._4_4_,iVar60 * 9);
      iVar53 = iVar60 * 8;
      lVar61 = uVar72 * 4;
      for (uVar50 = 0; (long)(uVar50 | 0xf) < (long)uVar57; uVar50 = uVar50 + 0x10) {
        local_120 = CONCAT44(local_120._4_4_,iVar84);
        local_128 = CONCAT44(local_128._4_4_,iVar24);
        local_130 = CONCAT44(local_130._4_4_,iVar53);
        pvVar28 = (this->super_Convolution).weight_data.data;
        local_2d8 = (void *)((long)iVar84 * 4 + (long)pvVar28);
        local_298 = (void *)((long)iVar24 * 4 + (long)pvVar28);
        local_228 = (void *)((long)(int)local_160 * 4 + (long)pvVar28);
        local_230 = (void *)((long)(int)local_110 * 4 + (long)pvVar28);
        local_238 = (void *)((long)(int)local_168 * 4 + (long)pvVar28);
        local_258 = (void *)((long)(int)local_170 * 4 + (long)pvVar28);
        local_210 = (void *)((long)(int)local_118 * 4 + (long)pvVar28);
        pvVar39 = (void *)((long)iVar53 * 4 + (long)pvVar28);
        pvVar81 = (void *)((long)iVar42 * 4 + (long)pvVar28);
        pvVar59 = (void *)((long)local_270 * 4 + (long)pvVar28);
        pvVar86 = (void *)((long)local_248 * 4 + (long)pvVar28);
        pvVar64 = (void *)((long)local_220 * 4 + (long)pvVar28);
        pvVar79 = (void *)((long)iVar83 * 4 + (long)pvVar28);
        pvVar41 = (void *)((long)local_268 * 4 + (long)pvVar28);
        pvVar55 = (void *)((long)iVar60 * 4 + (long)pvVar28);
        pvVar82 = (void *)((long)iVar74 * 4 + (long)pvVar28);
        local_2c0 = (long)iVar74 * 4 + lVar34 + (long)pvVar28;
        pauVar63 = (undefined1 (*) [64])
                   ((uVar50 >> 4) * (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        for (uVar30 = 0; (int)(uVar30 | 0xf) < (int)_h; uVar30 = uVar30 + 0x10) {
          for (lVar38 = 0; lVar61 - lVar38 != 0; lVar38 = lVar38 + 4) {
            auVar93 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar82 + lVar38) * 5));
            auVar94 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar55 + lVar38) * 5));
            auVar95 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar41 + lVar38) * 5));
            auVar96 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar79 + lVar38) * 5));
            auVar97 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar64 + lVar38) * 5));
            auVar98 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar86 + lVar38) * 5));
            auVar99 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar59 + lVar38) * 5));
            auVar100 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar81 + lVar38) * 5));
            auVar101 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar39 + lVar38) * 5));
            auVar102 = vgatherdps_avx512f(*(undefined4 *)(((long)local_210 + lVar38) * 5));
            auVar103 = vgatherdps_avx512f(*(undefined4 *)(((long)local_258 + lVar38) * 5));
            auVar104 = vgatherdps_avx512f(*(undefined4 *)(((long)local_238 + lVar38) * 5));
            auVar105 = vgatherdps_avx512f(*(undefined4 *)(((long)local_230 + lVar38) * 5));
            auVar106 = vgatherdps_avx512f(*(undefined4 *)(((long)local_228 + lVar38) * 5));
            vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
            auVar107 = vgatherdps_avx512f(*(undefined4 *)(((long)local_298 + lVar38) * 5));
            vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
            auVar108 = vgatherdps_avx512f(*(undefined4 *)(((long)local_2d8 + lVar38) * 5));
            auVar92 = vunpcklps_avx512f(auVar93,auVar94);
            auVar93 = vunpckhps_avx512f(auVar93,auVar94);
            auVar94 = vunpcklps_avx512f(auVar95,auVar96);
            auVar95 = vunpckhps_avx512f(auVar95,auVar96);
            auVar96 = vunpcklps_avx512f(auVar97,auVar98);
            auVar97 = vunpckhps_avx512f(auVar97,auVar98);
            auVar98 = vunpcklps_avx512f(auVar99,auVar100);
            auVar99 = vunpckhps_avx512f(auVar99,auVar100);
            auVar100 = vunpcklps_avx512f(auVar101,auVar102);
            auVar101 = vunpckhps_avx512f(auVar101,auVar102);
            auVar102 = vunpcklps_avx512f(auVar103,auVar104);
            auVar103 = vunpckhps_avx512f(auVar103,auVar104);
            auVar104 = vunpcklps_avx512f(auVar105,auVar106);
            auVar105 = vunpckhps_avx512f(auVar105,auVar106);
            auVar106 = vunpcklps_avx512f(auVar107,auVar108);
            auVar107 = vunpckhps_avx512f(auVar107,auVar108);
            auVar108 = vunpcklpd_avx512f(auVar92,auVar94);
            auVar94 = vunpckhpd_avx512f(auVar92,auVar94);
            auVar92 = vunpcklpd_avx512f(auVar93,auVar95);
            auVar93 = vunpckhpd_avx512f(auVar93,auVar95);
            auVar95 = vunpcklpd_avx512f(auVar96,auVar98);
            auVar96 = vunpckhpd_avx512f(auVar96,auVar98);
            auVar98 = vunpcklpd_avx512f(auVar97,auVar99);
            auVar97 = vunpckhpd_avx512f(auVar97,auVar99);
            auVar99 = vunpcklpd_avx512f(auVar100,auVar102);
            auVar100 = vunpckhpd_avx512f(auVar100,auVar102);
            auVar102 = vunpcklpd_avx512f(auVar101,auVar103);
            auVar101 = vunpckhpd_avx512f(auVar101,auVar103);
            auVar103 = vunpcklpd_avx512f(auVar104,auVar106);
            auVar104 = vunpckhpd_avx512f(auVar104,auVar106);
            auVar106 = vunpcklpd_avx512f(auVar105,auVar107);
            auVar105 = vunpckhpd_avx512f(auVar105,auVar107);
            auVar107 = vshuff64x2_avx512f(auVar108,auVar95,0x88);
            auVar109 = vshuff64x2_avx512f(auVar99,auVar103,0x88);
            auVar110 = vshuff64x2_avx512f(auVar94,auVar96,0x88);
            auVar111 = vshuff64x2_avx512f(auVar100,auVar104,0x88);
            auVar112 = vshuff64x2_avx512f(auVar92,auVar98,0x88);
            auVar113 = vshuff64x2_avx512f(auVar102,auVar106,0x88);
            auVar114 = vshuff64x2_avx512f(auVar93,auVar97,0x88);
            auVar115 = vshuff64x2_avx512f(auVar101,auVar105,0x88);
            auVar95 = vshuff64x2_avx512f(auVar108,auVar95,0xdd);
            auVar99 = vshuff64x2_avx512f(auVar99,auVar103,0xdd);
            auVar94 = vshuff64x2_avx512f(auVar94,auVar96,0xdd);
            auVar96 = vshuff64x2_avx512f(auVar100,auVar104,0xdd);
            auVar98 = vshuff64x2_avx512f(auVar92,auVar98,0xdd);
            auVar100 = vshuff64x2_avx512f(auVar102,auVar106,0xdd);
            auVar93 = vshuff64x2_avx512f(auVar93,auVar97,0xdd);
            auVar97 = vshuff64x2_avx512f(auVar101,auVar105,0xdd);
            auVar101 = vshuff64x2_avx512f(auVar107,auVar109,0x88);
            auVar102 = vshuff64x2_avx512f(auVar110,auVar111,0x88);
            auVar103 = vshuff64x2_avx512f(auVar112,auVar113,0x88);
            auVar104 = vshuff64x2_avx512f(auVar114,auVar115,0x88);
            auVar105 = vshuff64x2_avx512f(auVar95,auVar99,0x88);
            auVar106 = vshuff64x2_avx512f(auVar94,auVar96,0x88);
            in_ZMM17 = vshuff64x2_avx512f(auVar98,auVar100,0x88);
            auVar108 = vshuff64x2_avx512f(auVar93,auVar97,0x88);
            in_ZMM16 = vshuff64x2_avx512f(auVar107,auVar109,0xdd);
            auVar107 = vshuff64x2_avx512f(auVar110,auVar111,0xdd);
            auVar92 = vshuff64x2_avx512f(auVar112,auVar113,0xdd);
            auVar109 = vshuff64x2_avx512f(auVar114,auVar115,0xdd);
            in_ZMM4 = vshuff64x2_avx512f(auVar95,auVar99,0xdd);
            in_ZMM3 = vshuff64x2_avx512f(auVar94,auVar96,0xdd);
            auVar94 = vshuff64x2_avx512f(auVar98,auVar100,0xdd);
            auVar93 = vshuff64x2_avx512f(auVar93,auVar97,0xdd);
            *pauVar63 = auVar101;
            pauVar63[1] = auVar102;
            pauVar63[2] = auVar103;
            pauVar63[3] = auVar104;
            pauVar63[4] = auVar105;
            pauVar63[5] = auVar106;
            pauVar63[6] = in_ZMM17;
            pauVar63[7] = auVar108;
            pauVar63[8] = in_ZMM16;
            pauVar63[9] = auVar107;
            pauVar63[10] = auVar92;
            pauVar63[0xb] = auVar109;
            pauVar63[0xc] = in_ZMM4;
            pauVar63[0xd] = in_ZMM3;
            pauVar63[0xe] = auVar94;
            pauVar63[0xf] = auVar93;
            pauVar63 = pauVar63 + 0x10;
          }
          pvVar82 = (void *)((long)pvVar82 + lVar45);
          local_2d8 = (void *)((long)local_2d8 + lVar45);
          local_298 = (void *)((long)local_298 + lVar45);
          local_228 = (void *)((long)local_228 + lVar45);
          local_230 = (void *)((long)local_230 + lVar45);
          local_238 = (void *)((long)local_238 + lVar45);
          local_258 = (void *)((long)local_258 + lVar45);
          local_210 = (void *)((long)local_210 + lVar45);
          pvVar39 = (void *)((long)pvVar39 + lVar45);
          pvVar81 = (void *)((long)pvVar81 + lVar45);
          pvVar59 = (void *)((long)pvVar59 + lVar45);
          pvVar86 = (void *)((long)pvVar86 + lVar45);
          pvVar64 = (void *)((long)pvVar64 + lVar45);
          pvVar79 = (void *)((long)pvVar79 + lVar45);
          pvVar41 = (void *)((long)pvVar41 + lVar45);
          pvVar55 = (void *)((long)pvVar55 + lVar45);
          local_2c0 = local_2c0 + lVar45;
        }
        for (; (int)(uVar30 | 7) < (int)_h; uVar30 = uVar30 + 8) {
          pvVar28 = pvVar82;
          for (uVar37 = 0; uVar37 != uVar72; uVar37 = uVar37 + 1) {
            pvVar39 = pvVar28;
            for (lVar38 = 0; (int)lVar38 != 0x200; lVar38 = lVar38 + 0x40) {
              auVar93 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar39 + lVar85 * 0x10));
              *(undefined1 (*) [64])((long)*pauVar63 + lVar38) = auVar93;
              pvVar39 = (void *)((long)pvVar39 + lVar34);
            }
            pvVar28 = (void *)((long)pvVar28 + 4);
            pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + lVar38);
          }
          pvVar82 = (void *)((long)pvVar82 + lVar26);
          local_2c0 = local_2c0 + lVar26;
        }
        for (; (int)(uVar30 | 3) < (int)_h; uVar30 = uVar30 + 4) {
          pvVar28 = pvVar82;
          for (uVar37 = 0; uVar37 != uVar72; uVar37 = uVar37 + 1) {
            pvVar39 = pvVar28;
            for (lVar38 = 0; (int)lVar38 != 0x100; lVar38 = lVar38 + 0x40) {
              auVar93 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar39 + lVar85 * 0x10));
              *(undefined1 (*) [64])((long)*pauVar63 + lVar38) = auVar93;
              pvVar39 = (void *)((long)pvVar39 + lVar34);
            }
            pvVar28 = (void *)((long)pvVar28 + 4);
            pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + lVar38);
          }
          pvVar82 = (void *)((long)pvVar82 + lVar27);
          local_2c0 = local_2c0 + lVar27;
        }
        for (; (int)(uVar30 | 1) < (int)_h; uVar30 = uVar30 + 2) {
          for (lVar38 = 0; lVar61 - lVar38 != 0; lVar38 = lVar38 + 4) {
            auVar93 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar82 + lVar85 * 0x10 + lVar38));
            *pauVar63 = auVar93;
            auVar93 = vgatherdps_avx512f(*(undefined4 *)(local_2c0 + lVar38 + lVar85 * 0x10));
            pauVar63[1] = auVar93;
            pauVar63 = pauVar63 + 2;
          }
          pvVar82 = (void *)((long)pvVar82 + lVar78);
          local_2c0 = local_2c0 + lVar78;
        }
        for (; (int)uVar30 < (int)_h; uVar30 = uVar30 + 1) {
          for (lVar38 = 0; lVar61 - lVar38 != 0; lVar38 = lVar38 + 4) {
            auVar93 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar82 + lVar85 * 0x10 + lVar38));
            *pauVar63 = auVar93;
            pauVar63 = pauVar63 + 1;
          }
        }
        iVar74 = iVar74 + iVar65;
        iVar60 = iVar60 + iVar65;
        iVar83 = iVar83 + iVar65;
        local_268 = local_268 + iVar65;
        iVar42 = iVar42 + iVar65;
        local_270 = local_270 + iVar65;
        local_248 = local_248 + iVar65;
        local_220 = local_220 + iVar65;
        iVar84 = iVar84 + iVar65;
        iVar24 = iVar24 + iVar65;
        local_160 = CONCAT44(local_160._4_4_,(int)local_160 + iVar65);
        local_110 = CONCAT44(local_110._4_4_,(int)local_110 + iVar65);
        local_168 = CONCAT44(local_168._4_4_,(int)local_168 + iVar65);
        local_170 = CONCAT44(local_170._4_4_,(int)local_170 + iVar65);
        local_118 = CONCAT44(local_118._4_4_,(int)local_118 + iVar65);
        iVar53 = iVar53 + iVar65;
      }
      auVar90 = vpbroadcastd_avx512vl();
      auVar90 = vpmulld_avx2(auVar90,_DAT_0053a680);
      auVar91 = vpbroadcastd_avx512vl();
      vpmulld_avx2(auVar90,auVar91);
      iVar24 = uVar73 * _h;
      iVar53 = iVar24 * 8;
      for (; (long)(uVar50 | 7) < (long)uVar57; uVar50 = uVar50 + 8) {
        pauVar63 = (undefined1 (*) [64])
                   ((ulong)(((uint)(uVar50 >> 4) & 0xfffffff) + (uint)(((uint)uVar50 >> 3 & 1) != 0)
                           ) * (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        pvVar82 = (this->super_Convolution).weight_data.data;
        pvVar64 = (void *)((long)iVar42 * 4 + (long)pvVar82);
        pvVar41 = (void *)((long)local_270 * 4 + (long)pvVar82);
        pvVar59 = (void *)((long)local_248 * 4 + (long)pvVar82);
        pvVar55 = (void *)((long)local_220 * 4 + (long)pvVar82);
        pvVar39 = (void *)((long)iVar83 * 4 + (long)pvVar82);
        pvVar81 = (void *)((long)local_268 * 4 + (long)pvVar82);
        pvVar28 = (void *)((long)iVar60 * 4 + (long)pvVar82);
        pvVar82 = (void *)((long)pvVar82 + (long)iVar74 * 4);
        for (uVar30 = 0; (int)(uVar30 | 0xf) < (int)_h; uVar30 = uVar30 + 0x10) {
          for (lVar85 = 0; lVar61 - lVar85 != 0; lVar85 = lVar85 + 4) {
            auVar93 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar82 + (long)pvVar28 * 4 + lVar85)
                                        );
            auVar94 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar28 * 5 + lVar85));
            auVar95 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar81 + (long)pvVar28 * 4 + lVar85)
                                        );
            auVar96 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar39 + (long)pvVar28 * 4 + lVar85)
                                        );
            auVar97 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar55 + (long)pvVar28 * 4 + lVar85)
                                        );
            auVar98 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar59 + (long)pvVar28 * 4 + lVar85)
                                        );
            auVar99 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar41 + (long)pvVar28 * 4 + lVar85)
                                        );
            auVar100 = vgatherdps_avx512f(*(undefined4 *)
                                           ((long)pvVar64 + (long)pvVar28 * 4 + lVar85));
            auVar101 = vunpcklps_avx512f(auVar93,auVar94);
            auVar93 = vunpckhps_avx512f(auVar93,auVar94);
            auVar94 = vunpcklps_avx512f(auVar95,auVar96);
            auVar95 = vunpckhps_avx512f(auVar95,auVar96);
            auVar96 = vunpcklps_avx512f(auVar97,auVar98);
            auVar97 = vunpckhps_avx512f(auVar97,auVar98);
            auVar98 = vunpcklps_avx512f(auVar99,auVar100);
            auVar99 = vunpckhps_avx512f(auVar99,auVar100);
            auVar100 = vunpcklpd_avx512f(auVar101,auVar94);
            auVar94 = vunpckhpd_avx512f(auVar101,auVar94);
            auVar101 = vunpcklpd_avx512f(auVar93,auVar95);
            auVar93 = vunpckhpd_avx512f(auVar93,auVar95);
            auVar95 = vunpcklpd_avx512f(auVar96,auVar98);
            auVar96 = vunpckhpd_avx512f(auVar96,auVar98);
            auVar98 = vunpcklpd_avx512f(auVar97,auVar99);
            auVar97 = vunpckhpd_avx512f(auVar97,auVar99);
            auVar99 = vshuff64x2_avx512f(auVar100,auVar95,0x88);
            auVar102 = vshuff64x2_avx512f(auVar94,auVar96,0x88);
            auVar103 = vshuff64x2_avx512f(auVar101,auVar98,0x88);
            auVar104 = vshuff64x2_avx512f(auVar93,auVar97,0x88);
            auVar95 = vshuff64x2_avx512f(auVar100,auVar95,0xdd);
            auVar94 = vshuff64x2_avx512f(auVar94,auVar96,0xdd);
            auVar96 = vshuff64x2_avx512f(auVar101,auVar98,0xdd);
            auVar93 = vshuff64x2_avx512f(auVar93,auVar97,0xdd);
            auVar97 = vshuff64x2_avx512f(auVar99,auVar102,0x88);
            auVar98 = vshuff64x2_avx512f(auVar103,auVar104,0x88);
            auVar100 = vshuff64x2_avx512f(auVar95,auVar94,0x88);
            auVar101 = vshuff64x2_avx512f(auVar96,auVar93,0x88);
            auVar99 = vshuff64x2_avx512f(auVar99,auVar102,0xdd);
            auVar102 = vshuff64x2_avx512f(auVar103,auVar104,0xdd);
            in_ZMM4 = vshuff64x2_avx512f(auVar95,auVar94,0xdd);
            in_ZMM3 = vshuff64x2_avx512f(auVar96,auVar93,0xdd);
            *pauVar63 = auVar97;
            pauVar63[1] = auVar98;
            pauVar63[2] = auVar100;
            pauVar63[3] = auVar101;
            pauVar63[4] = auVar99;
            pauVar63[5] = auVar102;
            pauVar63[6] = in_ZMM4;
            pauVar63[7] = in_ZMM3;
            pauVar63 = pauVar63 + 8;
          }
          pvVar82 = (void *)((long)pvVar82 + lVar45);
          pvVar28 = (void *)((long)pvVar28 + lVar45);
          pvVar81 = (void *)((long)pvVar81 + lVar45);
          pvVar39 = (void *)((long)pvVar39 + lVar45);
          pvVar55 = (void *)((long)pvVar55 + lVar45);
          pvVar59 = (void *)((long)pvVar59 + lVar45);
          pvVar41 = (void *)((long)pvVar41 + lVar45);
          pvVar64 = (void *)((long)pvVar64 + lVar45);
        }
        for (; (int)(uVar30 | 7) < (int)_h; uVar30 = uVar30 + 8) {
          for (lVar85 = 0; lVar61 - lVar85 != 0; lVar85 = lVar85 + 4) {
            auVar90 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
            auVar91 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            auVar90 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar118 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            auVar90 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar120 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            auVar90 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar121 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            auVar90 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar123 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            auVar90 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar124 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            auVar90 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar125 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            auVar90 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar128 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            auVar90 = vunpcklps_avx(auVar91,auVar118);
            auVar91 = vunpckhps_avx(auVar91,auVar118);
            auVar122 = vunpcklps_avx(auVar120,auVar121);
            auVar118 = vunpckhps_avx(auVar120,auVar121);
            auVar14 = vunpcklps_avx(auVar123,auVar124);
            auVar120 = vunpckhps_avx(auVar123,auVar124);
            auVar119 = vunpcklps_avx(auVar125,auVar128);
            auVar121 = vunpckhps_avx(auVar125,auVar128);
            auVar123 = vunpcklpd_avx(auVar90,auVar122);
            auVar90 = vunpckhpd_avx(auVar90,auVar122);
            auVar122 = vunpcklpd_avx(auVar91,auVar118);
            auVar91 = vunpckhpd_avx(auVar91,auVar118);
            auVar124 = vunpcklpd_avx(auVar14,auVar119);
            auVar118 = vunpckhpd_avx(auVar14,auVar119);
            auVar14 = vunpcklpd_avx(auVar120,auVar121);
            auVar120 = vunpckhpd_avx(auVar120,auVar121);
            auVar126._16_16_ = auVar124._0_16_;
            auVar126._0_16_ = auVar123._0_16_;
            auVar129._16_16_ = auVar118._0_16_;
            auVar129._0_16_ = auVar90._0_16_;
            auVar130._16_16_ = auVar14._0_16_;
            auVar130._0_16_ = auVar122._0_16_;
            auVar131._16_16_ = auVar120._0_16_;
            auVar131._0_16_ = auVar91._0_16_;
            auVar121 = vperm2f128_avx(auVar123,auVar124,0x31);
            auVar90 = vperm2f128_avx(auVar90,auVar118,0x31);
            in_ZMM3 = ZEXT3264(auVar90);
            auVar118 = vperm2f128_avx(auVar122,auVar14,0x31);
            auVar91 = vperm2f128_avx(auVar91,auVar120,0x31);
            in_ZMM4 = ZEXT3264(auVar91);
            *(undefined1 (*) [32])*pauVar63 = auVar126;
            *(undefined1 (*) [32])((long)*pauVar63 + 0x20) = auVar129;
            *(undefined1 (*) [32])pauVar63[1] = auVar130;
            *(undefined1 (*) [32])(pauVar63[1] + 0x20) = auVar131;
            *(undefined1 (*) [32])pauVar63[2] = auVar121;
            *(undefined1 (*) [32])(pauVar63[2] + 0x20) = auVar90;
            *(undefined1 (*) [32])pauVar63[3] = auVar118;
            *(undefined1 (*) [32])(pauVar63[3] + 0x20) = auVar91;
            pauVar63 = pauVar63 + 4;
          }
        }
        for (; (int)(uVar30 | 3) < (int)_h; uVar30 = uVar30 + 4) {
          for (uVar37 = 0; uVar37 != uVar72; uVar37 = uVar37 + 1) {
            for (lVar85 = 0; (int)lVar85 != 0x80; lVar85 = lVar85 + 0x20) {
              auVar90 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
              auVar90 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
              in_ZMM4 = ZEXT3264(auVar90);
              in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
              *(undefined1 (*) [32])((long)*pauVar63 + lVar85) = auVar90;
            }
            pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + lVar85);
          }
        }
        for (; (int)(uVar30 | 1) < (int)_h; uVar30 = uVar30 + 2) {
          for (lVar85 = 0; lVar61 - lVar85 != 0; lVar85 = lVar85 + 4) {
            auVar90 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
            auVar90 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            *(undefined1 (*) [32])*pauVar63 = auVar90;
            auVar90 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar90 = vgatherdps(ZEXT832(0) << 0x20,auVar90);
            in_ZMM4 = ZEXT3264(auVar90);
            in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])((long)*pauVar63 + 0x20) = auVar90;
            pauVar63 = pauVar63 + 1;
          }
        }
        for (; (int)uVar30 < (int)_h; uVar30 = uVar30 + 1) {
          for (lVar85 = 0; lVar61 - lVar85 != 0; lVar85 = lVar85 + 4) {
            auVar90 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
            auVar90 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            in_ZMM4 = ZEXT3264(auVar90);
            in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])*pauVar63 = auVar90;
            pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + 0x20);
          }
        }
        iVar74 = iVar74 + iVar53;
        iVar60 = iVar60 + iVar53;
        iVar83 = iVar83 + iVar53;
        local_268 = local_268 + iVar53;
        iVar42 = iVar42 + iVar53;
        local_270 = local_270 + iVar53;
        local_248 = local_248 + iVar53;
        local_220 = local_220 + iVar53;
      }
      auVar88 = vpbroadcastd_avx512vl();
      auVar88 = vpmulld_avx(auVar88,_DAT_00539310);
      auVar89 = vpbroadcastd_avx512vl();
      auVar88 = vpmulld_avx(auVar88,auVar89);
      auVar93 = ZEXT1664(auVar88);
      iVar42 = iVar24 * 4;
      for (; (long)(uVar50 | 3) < (long)uVar57; uVar50 = uVar50 + 4) {
        pauVar63 = (undefined1 (*) [64])
                   ((ulong)(((uint)(uVar50 >> 3) & 1) + ((uint)(uVar50 >> 4) & 0xfffffff) +
                           (uint)(((uint)uVar50 >> 2 & 1) != 0)) * (this->weight_data_tm).cstep *
                    (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        pvVar82 = (this->super_Convolution).weight_data.data;
        pvVar28 = (void *)((long)iVar83 * 4 + (long)pvVar82);
        pvVar39 = (void *)((long)local_268 * 4 + (long)pvVar82);
        pvVar41 = (void *)((long)iVar60 * 4 + (long)pvVar82);
        pvVar82 = (void *)((long)pvVar82 + (long)iVar74 * 4);
        for (uVar30 = 0; (int)(uVar30 | 0xf) < (int)_h; uVar30 = uVar30 + 0x10) {
          for (lVar85 = 0; lVar61 - lVar85 != 0; lVar85 = lVar85 + 4) {
            auVar94 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar82 + (long)pvVar28 * 4 + lVar85)
                                        );
            auVar95 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar41 + (long)pvVar28 * 4 + lVar85)
                                        );
            auVar96 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar39 + (long)pvVar28 * 4 + lVar85)
                                        );
            auVar97 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar28 * 5 + lVar85));
            auVar98 = vunpcklps_avx512f(auVar94,auVar95);
            auVar94 = vunpckhps_avx512f(auVar94,auVar95);
            auVar95 = vunpcklps_avx512f(auVar96,auVar97);
            auVar96 = vunpckhps_avx512f(auVar96,auVar97);
            auVar97 = vunpcklpd_avx512f(auVar98,auVar95);
            auVar95 = vunpckhpd_avx512f(auVar98,auVar95);
            auVar98 = vunpcklpd_avx512f(auVar94,auVar96);
            auVar94 = vunpckhpd_avx512f(auVar94,auVar96);
            auVar96 = vshuff64x2_avx512f(auVar97,auVar95,0x88);
            auVar99 = vshuff64x2_avx512f(auVar98,auVar94,0x88);
            auVar95 = vshuff64x2_avx512f(auVar97,auVar95,0xdd);
            auVar94 = vshuff64x2_avx512f(auVar98,auVar94,0xdd);
            auVar97 = vshuff64x2_avx512f(auVar96,auVar99,0x88);
            auVar98 = vshuff64x2_avx512f(auVar95,auVar94,0x88);
            auVar96 = vshuff64x2_avx512f(auVar96,auVar99,0xdd);
            in_ZMM4 = vshuff64x2_avx512f(auVar95,auVar94,0xdd);
            *pauVar63 = auVar97;
            pauVar63[1] = auVar98;
            pauVar63[2] = auVar96;
            pauVar63[3] = in_ZMM4;
            pauVar63 = pauVar63 + 4;
          }
          pvVar82 = (void *)((long)pvVar82 + lVar45);
          pvVar41 = (void *)((long)pvVar41 + lVar45);
          pvVar39 = (void *)((long)pvVar39 + lVar45);
          pvVar28 = (void *)((long)pvVar28 + lVar45);
        }
        for (; (int)(uVar30 | 7) < (int)_h; uVar30 = uVar30 + 8) {
          for (lVar85 = 0; lVar61 - lVar85 != 0; lVar85 = lVar85 + 4) {
            auVar90 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
            auVar91 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            auVar90 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar118 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            auVar90 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar120 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            auVar90 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar123 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            auVar90 = vunpcklps_avx(auVar91,auVar118);
            auVar91 = vunpckhps_avx(auVar91,auVar118);
            auVar121 = vunpcklps_avx(auVar120,auVar123);
            auVar118 = vunpckhps_avx(auVar120,auVar123);
            auVar120 = vunpcklpd_avx(auVar90,auVar121);
            auVar90 = vunpckhpd_avx(auVar90,auVar121);
            auVar121 = vunpcklpd_avx(auVar91,auVar118);
            auVar91 = vunpckhpd_avx(auVar91,auVar118);
            auVar122._16_16_ = auVar90._0_16_;
            auVar122._0_16_ = auVar120._0_16_;
            auVar124._16_16_ = auVar91._0_16_;
            auVar124._0_16_ = auVar121._0_16_;
            auVar90 = vperm2f128_avx(auVar120,auVar90,0x31);
            in_ZMM4 = ZEXT3264(auVar90);
            auVar91 = vperm2f128_avx(auVar121,auVar91,0x31);
            *(undefined1 (*) [32])*pauVar63 = auVar122;
            *(undefined1 (*) [32])((long)*pauVar63 + 0x20) = auVar124;
            *(undefined1 (*) [32])pauVar63[1] = auVar90;
            *(undefined1 (*) [32])(pauVar63[1] + 0x20) = auVar91;
            pauVar63 = pauVar63 + 2;
          }
        }
        for (; (int)(uVar30 | 3) < (int)_h; uVar30 = uVar30 + 4) {
          for (lVar85 = 0; lVar61 - lVar85 != 0; lVar85 = lVar85 + 4) {
            auVar88 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
            auVar117 = vgatherdps(ZEXT816(0) << 0x40,auVar88);
            auVar88 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar12 = vgatherdps(ZEXT816(0) << 0x40,auVar88);
            auVar88 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar13 = vgatherdps(ZEXT816(0) << 0x40,auVar88);
            auVar88 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar88 = vgatherdps(ZEXT816(0) << 0x40,auVar88);
            auVar89 = vunpcklps_avx(auVar117,auVar12);
            auVar116 = vunpcklps_avx(auVar13,auVar88);
            auVar117 = vunpckhps_avx(auVar117,auVar12);
            auVar12 = vunpckhps_avx(auVar13,auVar88);
            auVar88 = vmovlhps_avx(auVar89,auVar116);
            auVar116 = vunpckhpd_avx(auVar89,auVar116);
            in_ZMM4 = ZEXT1664(auVar116);
            auVar89 = vmovlhps_avx(auVar117,auVar12);
            auVar117 = vunpckhpd_avx(auVar117,auVar12);
            *(undefined1 (*) [16])*pauVar63 = auVar88;
            *(undefined1 (*) [16])((long)*pauVar63 + 0x10) = auVar116;
            *(undefined1 (*) [16])((long)*pauVar63 + 0x20) = auVar89;
            *(undefined1 (*) [16])((long)*pauVar63 + 0x30) = auVar117;
            pauVar63 = pauVar63 + 1;
          }
        }
        for (; (int)(uVar30 | 1) < (int)_h; uVar30 = uVar30 + 2) {
          for (lVar85 = 0; lVar61 - lVar85 != 0; lVar85 = lVar85 + 4) {
            auVar88 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
            auVar88 = vgatherdps(ZEXT816(0) << 0x40,auVar88);
            *(undefined1 (*) [16])*pauVar63 = auVar88;
            auVar88 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar88 = vgatherdps(ZEXT816(0) << 0x20,auVar88);
            in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])((long)*pauVar63 + 0x10) = auVar88;
            pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + 0x20);
          }
        }
        for (; (int)uVar30 < (int)_h; uVar30 = uVar30 + 1) {
          for (lVar85 = 0; lVar61 - lVar85 != 0; lVar85 = lVar85 + 4) {
            auVar88 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
            auVar88 = vgatherdps(ZEXT816(0) << 0x40,auVar88);
            in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])*pauVar63 = auVar88;
            pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + 0x10);
          }
        }
        iVar74 = iVar74 + iVar42;
        iVar60 = iVar60 + iVar42;
        iVar83 = iVar83 + iVar42;
        local_268 = local_268 + iVar42;
      }
      uVar30 = iVar24 * 2;
      for (; (long)(uVar50 | 1) < (long)uVar57; uVar50 = uVar50 + 2) {
        pauVar63 = (undefined1 (*) [64])
                   ((ulong)(((uint)(uVar50 >> 2) & 1) +
                            ((uint)(uVar50 >> 4) & 0xfffffff) + (uint)(((uint)uVar50 >> 3 & 1) != 0)
                           + (uint)(((uint)uVar50 >> 1 & 1) != 0)) * (this->weight_data_tm).cstep *
                    (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        pvVar82 = (this->super_Convolution).weight_data.data;
        pvVar28 = (void *)((long)iVar60 * 4 + (long)pvVar82);
        pvVar82 = (void *)((long)iVar74 * 4 + (long)pvVar82);
        for (uVar75 = 0; (int)(uVar75 | 0xf) < (int)_h; uVar75 = uVar75 + 0x10) {
          for (lVar85 = 0; lVar61 - lVar85 != 0; lVar85 = lVar85 + 4) {
            auVar93 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar82 + (ulong)uVar30 * 4 + lVar85)
                                        );
            in_ZMM4 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar28 + (ulong)uVar30 * 4 + lVar85)
                                        );
            *pauVar63 = auVar93;
            pauVar63[1] = in_ZMM4;
            pauVar63 = pauVar63 + 2;
          }
          pvVar82 = (void *)((long)pvVar82 + lVar45);
          pvVar28 = (void *)((long)pvVar28 + lVar45);
        }
        for (; (int)(uVar75 | 7) < (int)_h; uVar75 = uVar75 + 8) {
          for (lVar85 = 0; lVar61 - lVar85 != 0; lVar85 = lVar85 + 4) {
            auVar90 = vpcmpeqd_avx2(auVar93._0_32_,auVar93._0_32_);
            auVar91 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            in_ZMM4 = ZEXT3264(auVar91);
            auVar90 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar90 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar90);
            auVar93 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])*pauVar63 = auVar91;
            *(undefined1 (*) [32])((long)*pauVar63 + 0x20) = auVar90;
            pauVar63 = pauVar63 + 1;
          }
          pvVar82 = (void *)((long)pvVar82 + lVar26);
          pvVar28 = (void *)((long)pvVar28 + lVar26);
        }
        for (; (int)(uVar75 | 3) < (int)_h; uVar75 = uVar75 + 4) {
          for (lVar85 = 0; lVar61 - lVar85 != 0; lVar85 = lVar85 + 4) {
            auVar88 = vpcmpeqd_avx(auVar93._0_16_,auVar93._0_16_);
            auVar89 = vgatherdps(ZEXT816(0) << 0x40,auVar88);
            in_ZMM4 = ZEXT1664(auVar89);
            auVar88 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar88 = vgatherdps(ZEXT816(0) << 0x40,auVar88);
            auVar93 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])*pauVar63 = auVar89;
            *(undefined1 (*) [16])((long)*pauVar63 + 0x10) = auVar88;
            pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + 0x20);
          }
          pvVar82 = (void *)((long)pvVar82 + lVar27);
          pvVar28 = (void *)((long)pvVar28 + lVar27);
        }
        for (; (int)(uVar75 | 1) < (int)_h; uVar75 = uVar75 + 2) {
          pvVar39 = pvVar28;
          pvVar41 = pvVar82;
          for (uVar37 = 0; uVar37 != uVar72; uVar37 = uVar37 + 1) {
            lVar38 = 0;
            for (lVar85 = 0; (int)lVar85 != 0x10; lVar85 = lVar85 + 8) {
              *(undefined4 *)((long)*pauVar63 + lVar85) = *(undefined4 *)((long)pvVar41 + lVar38);
              auVar93 = ZEXT464(*(uint *)((long)pvVar39 + lVar38));
              *(uint *)((long)*pauVar63 + lVar85 + 4) = *(uint *)((long)pvVar39 + lVar38);
              lVar38 = lVar38 + lVar34;
            }
            pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + lVar85);
            pvVar41 = (void *)((long)pvVar41 + 4);
            pvVar39 = (void *)((long)pvVar39 + 4);
          }
          pvVar82 = (void *)((long)pvVar82 + lVar78);
          pvVar28 = (void *)((long)pvVar28 + lVar78);
        }
        for (; (int)uVar75 < (int)_h; uVar75 = uVar75 + 1) {
          for (uVar37 = 0; uVar72 != uVar37; uVar37 = uVar37 + 1) {
            *(undefined4 *)*pauVar63 = *(undefined4 *)((long)pvVar82 + uVar37 * 4);
            uVar46 = *(uint *)((long)pvVar28 + uVar37 * 4);
            auVar93 = ZEXT464(uVar46);
            *(uint *)((long)*pauVar63 + 4) = uVar46;
            pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + 8);
          }
        }
        iVar74 = iVar74 + uVar30;
        iVar60 = iVar60 + uVar30;
      }
      for (; (long)uVar50 < (long)uVar57; uVar50 = uVar50 + 1) {
        pvVar28 = (this->super_Convolution).weight_data.data;
        uVar30 = (uint)uVar50;
        pauVar63 = (undefined1 (*) [64])
                   ((ulong)((uVar30 & 1) + ((uint)(uVar50 >> 4) & 0xfffffff) +
                            (uint)((uVar30 >> 3 & 1) != 0) + ((uint)(uVar50 >> 2) & 1) +
                           (uint)((uVar30 >> 1 & 1) != 0)) * (this->weight_data_tm).cstep *
                    (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        pvVar82 = (void *)((long)pvVar28 + (long)iVar74 * 4);
        lVar85 = (long)iVar74 * 4 + lVar34 + (long)pvVar28;
        for (uVar30 = 0; (int)(uVar30 | 0xf) < (int)_h; uVar30 = uVar30 + 0x10) {
          for (lVar38 = 0; lVar61 - lVar38 != 0; lVar38 = lVar38 + 4) {
            auVar93 = vgatherdps_avx512f(*(undefined4 *)
                                          ((long)pvVar82 + (long)pauVar63 * 4 + lVar38));
            *pauVar63 = auVar93;
            pauVar63 = pauVar63 + 1;
          }
          pvVar82 = (void *)((long)pvVar82 + lVar45);
          lVar85 = lVar85 + lVar45;
        }
        for (; (int)(uVar30 | 7) < (int)_h; uVar30 = uVar30 + 8) {
          for (lVar38 = 0; lVar61 - lVar38 != 0; lVar38 = lVar38 + 4) {
            auVar90 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
            auVar90 = vgatherdps(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar90);
            in_ZMM4 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])*pauVar63 = auVar90;
            pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + 0x20);
          }
          pvVar82 = (void *)((long)pvVar82 + lVar26);
          lVar85 = lVar85 + lVar26;
        }
        for (; (int)(uVar30 | 3) < (int)_h; uVar30 = uVar30 + 4) {
          for (lVar38 = 0; lVar61 - lVar38 != 0; lVar38 = lVar38 + 4) {
            auVar88 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
            auVar88 = vgatherdps((undefined1  [16])0x0,auVar88);
            in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])*pauVar63 = auVar88;
            pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + 0x10);
          }
          pvVar82 = (void *)((long)pvVar82 + lVar27);
          lVar85 = lVar85 + lVar27;
        }
        for (; (int)(uVar30 | 1) < (int)_h; uVar30 = uVar30 + 2) {
          for (uVar37 = 0; uVar72 != uVar37; uVar37 = uVar37 + 1) {
            *(undefined4 *)*pauVar63 = *(undefined4 *)((long)pvVar82 + uVar37 * 4);
            *(undefined4 *)((long)*pauVar63 + 4) = *(undefined4 *)(lVar85 + uVar37 * 4);
            pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + 8);
          }
          pvVar82 = (void *)((long)pvVar82 + lVar78);
          lVar85 = lVar85 + lVar78;
        }
        for (; (int)uVar30 < (int)_h; uVar30 = uVar30 + 1) {
          for (lVar85 = 0; lVar61 - lVar85 != 0; lVar85 = lVar85 + 4) {
            *(undefined4 *)((long)*pauVar63 + lVar85) = *(undefined4 *)((long)pvVar82 + lVar85);
          }
          pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + lVar85);
        }
        iVar74 = iVar74 + iVar24;
      }
    }
    cVar1 = opt->lightmode;
    goto joined_r0x00174915;
  }
  pMVar6 = (this->super_Convolution).super_Layer.bottom_shapes.
           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (((pMVar6 == (this->super_Convolution).super_Layer.bottom_shapes.
                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish) || (pMVar6->w == 0)) || (pMVar6->h == 0)) {
    pMVar31 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar36 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (((pMVar31 != pMVar36) && (pMVar31->w != 0)) && (pMVar31->h != 0)) goto LAB_00172f9f;
    if ((((int)uVar30 < 0x21) && (opt->use_winograd63_convolution != false)) && ((int)_h < 0x21)) {
LAB_00173844:
      conv3x3s1_winograd63_transform_kernel
                (&(this->super_Convolution).weight_data,&this->weight_winograd63_data,_h,uVar30,opt)
      ;
    }
    else {
      if (opt->use_winograd43_convolution != true) goto LAB_00173621;
LAB_001735eb:
      conv3x3s1_winograd43_transform_kernel
                (&(this->super_Convolution).weight_data,&this->weight_winograd43_data,_h,uVar30,opt)
      ;
    }
  }
  else {
    pMVar31 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar36 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish;
LAB_00172f9f:
    if (((pMVar31 == pMVar36) || (pMVar31->w == 0)) || (pMVar31->h == 0)) {
      iVar74 = pMVar6->w;
      iVar83 = pMVar6->h;
      iVar42 = (this->super_Convolution).pad_left;
      iVar60 = (this->super_Convolution).pad_right;
      if (((iVar60 < 1 && iVar42 < 1) && (iVar24 = (this->super_Convolution).pad_top, iVar24 < 1))
         && (iVar53 = (this->super_Convolution).pad_bottom, iVar53 < 1)) {
        if ((iVar53 == -0xe9 && (iVar24 == -0xe9 && (iVar60 == -0xe9 && iVar42 == -0xe9))) ||
           (iVar53 == -0xea && (iVar24 == -0xea && (iVar60 == -0xea && iVar42 == -0xea)))) {
          iVar74 = iVar74 + 2;
          iVar83 = iVar83 + 2;
        }
      }
      else {
        iVar74 = iVar42 + iVar74 + iVar60;
        iVar83 = iVar83 + (this->super_Convolution).pad_top + (this->super_Convolution).pad_bottom;
      }
    }
    else {
      iVar74 = pMVar31->w + 2;
      iVar83 = pMVar31->h + 2;
    }
    bVar22 = test_prefer_winograd63(_h,uVar30,iVar74,iVar83);
    bVar21 = test_prefer_winograd23(_h,uVar30,iVar74,iVar83);
    bVar29 = bVar21 & bVar35;
    if (!bVar21) {
      bVar35 = bVar22;
    }
    if ((bool)bVar22) {
      bVar23 = opt->use_winograd63_convolution;
      if ((bVar35 & bVar23) != 0) goto LAB_00173515;
LAB_001735c2:
      if (opt->use_winograd43_convolution == false) {
        if (bVar29 != 0 || opt->use_winograd63_convolution != true) goto LAB_00173621;
        bVar22 = bVar23 | opt->use_winograd63_convolution;
        goto LAB_0017382c;
      }
      if (bVar29 == 0) goto LAB_001735eb;
    }
    else {
      if (bVar35 == 0) {
        bVar23 = 0;
        goto LAB_001735c2;
      }
LAB_00173515:
      if (bVar29 == 0) {
LAB_0017382c:
        if (bVar22 != 0) goto LAB_00173844;
        goto LAB_0017384c;
      }
    }
LAB_00173621:
    conv3x3s1_winograd23_transform_kernel
              (&(this->super_Convolution).weight_data,&this->weight_winograd23_data,_h,uVar30,opt);
  }
LAB_0017384c:
  cVar1 = opt->lightmode;
joined_r0x00174915:
  if (cVar1 == '\x01') {
    piVar8 = (this->super_Convolution).weight_data.refcount;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        pAVar9 = (this->super_Convolution).weight_data.allocator;
        if (pAVar9 == (Allocator *)0x0) {
          free((this->super_Convolution).weight_data.data);
        }
        else {
          (*pAVar9->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
         (undefined1  [16])0x0;
    (this->super_Convolution).weight_data.data = (void *)0x0;
    (this->super_Convolution).weight_data.refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        convolution_im2col_gemm_transform_kernel(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
    {
        convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }
    else
    {
        convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}